

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::compSyncResidualCoarse
          (MLNodeLaplacian *this,MultiFab *sync_resid,MultiFab *a_phi,MultiFab *vold,MultiFab *rhcc,
          BoxArray *fine_grids,IntVect *ref_ratio)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Real RVar20;
  LinOpBCType LVar21;
  LinOpBCType LVar22;
  Geometry *this_00;
  DistributionMapping *cdm;
  BoxArray *ba;
  pointer paVar23;
  pointer paVar24;
  ulong uVar25;
  ulong uVar26;
  undefined8 *puVar27;
  FabArray<amrex::IArrayBox> *this_01;
  EBCellFlagFab *this_02;
  FabArray<amrex::FArrayBox> *this_03;
  int iVar28;
  GpuArray<amrex::LinOpBCType,_3U> bclo;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double *pdVar32;
  double *pdVar33;
  int i;
  FabType FVar34;
  long lVar35;
  long lVar36;
  int *piVar37;
  DataAllocator DVar38;
  long lVar39;
  long lVar40;
  Arena *arena;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  _func_int **pp_Var57;
  long lVar58;
  long lVar59;
  long lVar60;
  Box *domain;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  int iVar66;
  int iVar67;
  uint uVar68;
  int iVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  double *pdVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  _func_int **pp_Var94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  int iVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  bool bVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  Real RVar129;
  double dVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  ulong uVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  ulong uVar138;
  double dVar139;
  double dVar140;
  int iVar141;
  double dVar142;
  double dVar143;
  int iVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  Periodicity PVar152;
  int iVar153;
  int iVar154;
  long local_ff0;
  double *local_fe8;
  long local_fe0;
  double *local_fd8;
  long local_fc0;
  double *local_fb8;
  long local_fb0;
  double *local_fa0;
  long local_f98;
  long local_f90;
  long local_f88;
  long local_f78;
  long local_f70;
  long local_f68;
  long local_f60;
  long local_f58;
  long local_f50;
  long local_f48;
  long local_f40;
  long local_f38;
  long local_f20;
  long local_f08;
  long local_ef8;
  long local_ee8;
  long local_ee0;
  long local_ed8;
  long local_ec8;
  long local_eb8;
  long local_ea8;
  double *local_ea0;
  long local_e80;
  long local_e78;
  long local_e68;
  long local_e58;
  long local_e50;
  long local_e48;
  long local_e40;
  long local_e38;
  long local_e30;
  long local_e28;
  long local_e20;
  long local_e18;
  long local_e10;
  long local_e08;
  long local_e00;
  long local_de0;
  Box local_db8;
  long local_d90;
  long local_d88;
  long local_d80;
  long local_d78;
  ulong local_d70;
  Box bx_2;
  long local_d38;
  long local_d30;
  long local_d28;
  long local_d18;
  long local_d08;
  long local_d00;
  long local_cc8;
  long local_cc0;
  long local_cb8;
  long local_cb0;
  long local_ca8;
  long local_c88;
  Box bx;
  long local_c40;
  long local_c38;
  long local_c30;
  long local_c28;
  long local_c20;
  long local_c18;
  long local_c10;
  Box bx_1;
  int local_bc8;
  uint local_bc4;
  uint local_bc0;
  Box lhs;
  FabArray<amrex::FArrayBox> *local_b30;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_b28;
  Array4<const_int> local_af8;
  Box result;
  Box bx_3;
  Array4<const_double> local_a78;
  Box local_a38;
  Box bx_6;
  undefined4 uStack_9fc;
  int local_9f8;
  int local_9f4;
  int local_9f0;
  FabArray<amrex::EBCellFlagFab> *local_9d0;
  Array4<const_double> local_9b0;
  MFIter mfi_1;
  Real facz;
  Real facy;
  Real facx;
  Box bx_5;
  Box bx_4;
  int local_878;
  int local_874;
  int local_870;
  FArrayBox rhs;
  FArrayBox cn;
  FArrayBox sten;
  FArrayBox u;
  undefined1 local_6b8 [28];
  undefined4 uStack_69c;
  int local_698;
  int local_694;
  int local_690;
  double local_678;
  undefined8 uStack_670;
  double local_668;
  undefined8 uStack_660;
  double local_658;
  undefined8 uStack_650;
  double local_648;
  undefined8 uStack_640;
  double local_638;
  undefined8 uStack_630;
  double local_628;
  undefined8 uStack_620;
  double local_618;
  undefined8 uStack_610;
  double local_608;
  undefined8 uStack_600;
  double local_5f8;
  undefined8 uStack_5f0;
  double local_5e8;
  undefined8 uStack_5e0;
  undefined1 local_5d8 [16];
  Real fm2xm2y4z;
  undefined8 uStack_5c0;
  Real f2x2ymz;
  undefined8 uStack_5b0;
  Real f2xmy2z;
  Real fmx2y2z;
  undefined8 uStack_590;
  Real fxyz;
  undefined8 uStack_580;
  Real fm2x4ym2z;
  undefined8 uStack_570;
  Real f4xm2ym2z;
  undefined8 uStack_560;
  double local_558;
  undefined8 uStack_550;
  Real facy_2;
  Real facx_2;
  undefined8 uStack_530;
  Real facz_2;
  undefined8 uStack_520;
  Array4<const_double> local_518;
  Elixir steneli;
  Elixir rhseli;
  Elixir ueli;
  Array4<const_double> local_490;
  Box local_44c;
  Elixir cneli;
  MFItInfo local_414;
  MultiFab phi;
  BoxArray local_280;
  BoxArray local_218;
  iMultiFab crse_cc_mask;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&sync_resid->super_FabArray<amrex::FArrayBox>,0.0,0,
             (sync_resid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(sync_resid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  this_00 = *(Geometry **)
             &(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  cdm = *(DistributionMapping **)
         &(((this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>).
          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  ;
  ba = *(BoxArray **)
        &(((this->super_MLNodeLinOp).super_MLLinOp.m_grids.
           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x100000001;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       indexType;
  convert(&local_218,ba,(IntVect *)&crse_cc_mask);
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x0;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  convert(&local_280,fine_grids,(IntVect *)&crse_cc_mask);
  paVar23 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar24 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar25 = *(ulong *)paVar23->_M_elems;
  LVar21 = paVar23->_M_elems[2];
  bclo.arr = *&paVar23->_M_elems;
  uVar26 = *(ulong *)paVar24->_M_elems;
  LVar22 = paVar24->_M_elems[2];
  bchi.arr = *&paVar24->_M_elems;
  phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x100000001;
  phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = indexType;
  PVar152 = Geometry::periodicity(this_00);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar152.period.vect[0];
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar152.period.vect._1_7_
  ;
  mfi_1.fabArray._0_4_ = PVar152.period.vect[2];
  makeFineMask(&crse_cc_mask,ba,cdm,(IntVect *)&phi,&local_280,ref_ratio,(Periodicity *)&mfi_1,1,0);
  MFIter::MFIter((MFIter *)&phi,(FabArrayBase *)&crse_cc_mask,'\0');
  domain = &this_00->domain;
  iVar153 = (int)uVar26;
  iVar154 = (int)(uVar26 >> 0x20);
  if (phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_loshft.vect[0] <
      phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_loshft.vect[2]) {
    do {
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                ((Array4<int> *)&mfi_1,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,(MFIter *)&phi
                );
      BATransformer::operator()
                ((Box *)&rhs,
                 (BATransformer *)
                 (CONCAT44(phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                           m_op.m_indexType.m_typ.itype,
                           phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                           m_bat_type) + 8),
                 (Box *)((long)*(int *)(*(long *)phi.super_FabArray<amrex::FArrayBox>.
                                                 super_FabArrayBase.boxarray.m_bat.m_op._44_8_ +
                                       (long)phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase
                                             .boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0] * 4) *
                         0x1c + **(long **)(CONCAT44(phi.super_FabArray<amrex::FArrayBox>.
                                                     super_FabArrayBase.boxarray.m_bat.m_op.
                                                     m_indexType.m_typ.itype,
                                                     phi.super_FabArray<amrex::FArrayBox>.
                                                     super_FabArrayBase.boxarray.m_bat.m_bat_type) +
                                           0x50)));
      mlndlap_fillbc_cc<int>((Box *)&rhs,(Array4<int> *)&mfi_1,domain,bclo,bchi);
      MFIter::operator++((MFIter *)&phi);
    } while (phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[0] <
             phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[2]);
  }
  MFIter::~MFIter((MFIter *)&phi);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi_1.fabArray._0_4_ = 0;
  mfi_1.fabArray._4_4_ = 0;
  mfi_1.tile_size.vect[0] = 0;
  mfi_1.tile_size.vect[1] = 0;
  mfi_1.tile_size.vect[2] = 0;
  mfi_1.flags = '\0';
  mfi_1._29_3_ = 0;
  mfi_1.currentIndex = 0;
  mfi_1.beginIndex = 0;
  rhs.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__FabFactory_00712918;
  MultiFab::MultiFab(&phi,&local_218,cdm,1,1,(MFInfo *)&mfi_1,(FabFactory<amrex::FArrayBox> *)&rhs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi_1.tile_size);
  MFIter::MFIter(&mfi_1,(FabArrayBase *)&phi,true);
  if (mfi_1.currentIndex < mfi_1.endIndex) {
    do {
      MFIter::tilebox((Box *)&cn,&mfi_1);
      MFIter::growntilebox(&bx_1,&mfi_1,-1000000);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&rhs,&phi.super_FabArray<amrex::FArrayBox>,&mfi_1);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&u,&a_phi->super_FabArray<amrex::FArrayBox>,&mfi_1);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&sten,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,&mfi_1);
      if (bx_1.smallend.vect[2] <= bx_1.bigend.vect[2]) {
        lVar84 = (long)bx_1.smallend.vect[0];
        iVar69 = bx_1.smallend.vect[2] + -1;
        iVar105 = bx_1.smallend.vect[2];
        do {
          if (bx_1.smallend.vect[1] <= bx_1.bigend.vect[1]) {
            lVar35 = (long)iVar105;
            local_d70 = CONCAT44(local_d70._4_4_,bx_1.smallend.vect[1] + -1);
            iVar28 = bx_1.smallend.vect[1];
            do {
              if (bx_1.smallend.vect[0] <= bx_1.bigend.vect[0]) {
                lVar36 = (long)iVar28;
                lVar73 = (lVar36 - rhs.super_BaseFab<double>.domain.bigend.vect[0]) *
                         (long)rhs.super_BaseFab<double>.super_DataAllocator.m_arena;
                lVar61 = (lVar35 - rhs.super_BaseFab<double>.domain.bigend.vect[1]) *
                         (long)rhs.super_BaseFab<double>.dptr;
                lVar49 = (long)sten.super_BaseFab<double>.domain.smallend.vect[2];
                lVar74 = (long)(~sten.super_BaseFab<double>.domain.bigend.vect[1] + iVar105) *
                         (long)sten.super_BaseFab<double>.dptr;
                lVar75 = (long)(iVar105 - sten.super_BaseFab<double>.domain.bigend.vect[1]) *
                         (long)sten.super_BaseFab<double>.dptr;
                lVar62 = (lVar35 - sten.super_BaseFab<double>.domain.bigend.vect[1]) *
                         (long)sten.super_BaseFab<double>.dptr * 4;
                lVar93 = (long)(iVar69 - sten.super_BaseFab<double>.domain.bigend.vect[1]) *
                         (long)sten.super_BaseFab<double>.dptr * 4;
                lVar70 = (long)((int)local_d70 - sten.super_BaseFab<double>.domain.bigend.vect[0]) *
                         (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4;
                lVar50 = (lVar36 - sten.super_BaseFab<double>.domain.bigend.vect[0]) *
                         (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4;
                lVar63 = 0;
                lVar80 = lVar84;
                pp_Var94 = rhs.super_BaseFab<double>._vptr_BaseFab +
                           lVar84 + ((lVar61 + lVar73) -
                                    (long)rhs.super_BaseFab<double>.domain.smallend.vect[2]);
                do {
                  pp_Var57 = pp_Var94;
                  if (((((lVar84 + lVar63 < (long)(int)cn.super_BaseFab<double>._vptr_BaseFab) ||
                        (iVar28 < cn.super_BaseFab<double>._vptr_BaseFab._4_4_)) ||
                       (iVar105 < (int)cn.super_BaseFab<double>.super_DataAllocator.m_arena)) ||
                      (((long)cn.super_BaseFab<double>.super_DataAllocator.m_arena._4_4_ <
                        lVar84 + lVar63 || ((int)cn.super_BaseFab<double>.dptr < iVar28)))) ||
                     (cn.super_BaseFab<double>.dptr._4_4_ < iVar105)) {
LAB_00578eac:
                    *pp_Var57 = (_func_int *)0x0;
                  }
                  else {
                    (rhs.super_BaseFab<double>._vptr_BaseFab +
                    lVar84 + ((lVar61 + lVar73) -
                             (long)rhs.super_BaseFab<double>.domain.smallend.vect[2]))[lVar63] =
                         u.super_BaseFab<double>._vptr_BaseFab
                         [lVar84 + (((lVar35 - u.super_BaseFab<double>.domain.bigend.vect[1]) *
                                     (long)u.super_BaseFab<double>.dptr +
                                    (lVar36 - u.super_BaseFab<double>.domain.bigend.vect[0]) *
                                    (long)u.super_BaseFab<double>.super_DataAllocator.m_arena +
                                    lVar63) - (long)u.super_BaseFab<double>.domain.smallend.vect[2])
                         ];
                    lVar56 = (long)(((bx_1.smallend.vect[0] + -1) -
                                    sten.super_BaseFab<double>.domain.smallend.vect[2]) +
                                   (int)lVar63);
                    lVar81 = lVar56 * 4 +
                             (long)(~sten.super_BaseFab<double>.domain.bigend.vect[0] + iVar28) *
                             (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4;
                    if ((((*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                   lVar74 * 4 + lVar81) == 0) &&
                         (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                  lVar63 * 4 + lVar70 + lVar93 + lVar49 * -4 + lVar84 * 4) == 0)) &&
                        ((lVar56 = lVar56 * 4 +
                                   (long)(iVar28 - sten.super_BaseFab<double>.domain.bigend.vect[0])
                                   * (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena *
                                   4,
                         *(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                 lVar74 * 4 + lVar56) == 0 &&
                         (((*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                    lVar63 * 4 + lVar50 + lVar93 + lVar49 * -4 + lVar84 * 4) == 0 &&
                           (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                    lVar75 * 4 + lVar81) == 0)) &&
                          (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                   lVar63 * 4 + lVar70 + lVar62 + lVar49 * -4 + lVar84 * 4) == 0))))
                        )) && ((*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                        lVar75 * 4 + lVar56) == 0 &&
                               (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                        lVar63 * 4 + lVar62 + lVar50 + lVar49 * -4 + lVar84 * 4) ==
                                0)))) {
                      pp_Var57 = rhs.super_BaseFab<double>._vptr_BaseFab +
                                 lVar73 + lVar61 + (lVar80 - rhs.super_BaseFab<double>.domain.
                                                             smallend.vect[2]);
                      goto LAB_00578eac;
                    }
                  }
                  lVar80 = lVar80 + 1;
                  lVar63 = lVar63 + 1;
                  pp_Var94 = pp_Var94 + 1;
                } while ((bx_1.bigend.vect[0] - bx_1.smallend.vect[0]) + 1 != (int)lVar63);
              }
              local_d70 = CONCAT44(local_d70._4_4_,(int)local_d70 + 1);
              bVar112 = iVar28 != bx_1.bigend.vect[1];
              iVar28 = iVar28 + 1;
            } while (bVar112);
          }
          iVar69 = iVar69 + 1;
          bVar112 = iVar105 != bx_1.bigend.vect[2];
          iVar105 = iVar105 + 1;
        } while (bVar112);
      }
      MFIter::operator++(&mfi_1);
    } while (mfi_1.currentIndex < mfi_1.endIndex);
  }
  MFIter::~MFIter(&mfi_1);
  bx.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar120 = *(undefined8 *)((this_00->domain).smallend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(this_00->domain).bigend.vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((this_00->domain).bigend.vect + 2);
  bx.smallend.vect[2] = (int)uVar120;
  bx.bigend.vect[0] = (int)((ulong)uVar120 >> 0x20);
  lVar84 = 0;
  do {
    if ((bx.btype.itype >> ((uint)lVar84 & 0x1f) & 1) == 0) {
      piVar37 = bx.bigend.vect + lVar84;
      *piVar37 = *piVar37 + 1;
    }
    lVar84 = lVar84 + 1;
  } while (lVar84 != 3);
  bx.btype.itype = 7;
  dVar7 = (this_00->super_CoordSys).inv_dx[0];
  dVar8 = (this_00->super_CoordSys).inv_dx[1];
  dVar9 = (this_00->super_CoordSys).inv_dx[2];
  puVar27 = *(undefined8 **)
             &(((this->m_sigma).
                super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
              ).
              super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  this_01 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  lVar84 = **(long **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       ).
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if ((lVar84 == 0) ||
     (lVar84 = __dynamic_cast(lVar84,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0), lVar84 == 0)) {
    local_b28._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->m_integral).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    bVar112 = true;
    local_9d0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_b30 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_9d0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar84 + 0xd8));
    local_b28._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->m_integral).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    local_b30 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar84 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
    bVar112 = false;
  }
  local_414.num_streams = Gpu::Device::max_gpu_streams;
  local_414.do_tiling = true;
  local_414.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_414.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_414.tilesize.vect[2] = DAT_00717ec0;
  local_414.dynamic = true;
  local_414.device_sync = true;
  FArrayBox::FArrayBox(&rhs);
  FArrayBox::FArrayBox(&u);
  FArrayBox::FArrayBox(&sten);
  FArrayBox::FArrayBox(&cn);
  MFIter::MFIter(&mfi_1,(FabArrayBase *)sync_resid,&local_414);
  if (mfi_1.currentIndex < mfi_1.endIndex) {
    local_d70 = uVar25 >> 0x20;
    facx_2 = dVar7 * 0.027777777777777776 * dVar7;
    facy_2 = dVar8 * 0.027777777777777776 * dVar8;
    register0x000012c8 = 0;
    facz_2 = dVar9 * 0.027777777777777776 * dVar9;
    local_5d8._0_8_ = facy_2 + facy_2;
    local_5d8._8_8_ = 0;
    local_5e8 = facx_2 * 4.0;
    uStack_5e0 = 0;
    f4xm2ym2z = (local_5e8 - (double)local_5d8._0_8_) + facz_2 * -2.0;
    uStack_560 = 0;
    local_5f8 = facy_2 * 4.0;
    local_608 = facx_2 * -2.0;
    uStack_5f0 = 0;
    fm2x4ym2z = local_608 + local_5f8 + facz_2 * -2.0;
    uStack_570 = 0;
    fxyz = facx_2 + facy_2 + facz_2;
    uStack_580 = 0;
    local_618 = -facx_2;
    uStack_610 = 0x8000000000000000;
    local_558 = facz_2 + facz_2;
    fmx2y2z = ((double)local_5d8._0_8_ - facx_2) + local_558;
    uStack_590 = 0;
    local_628 = -facy_2;
    uStack_620 = 0x8000000000000000;
    uStack_530 = 0;
    local_638 = facx_2 + facx_2;
    f2xmy2z = (local_638 - facy_2) + local_558;
    register0x00001388 = 0;
    uStack_630 = 0;
    f2x2ymz = (local_638 + (double)local_5d8._0_8_) - facz_2;
    uStack_5b0 = 0;
    local_648 = -(double)local_5d8._0_8_;
    uStack_640 = 0x8000000000000000;
    uStack_600 = 0;
    local_658 = facz_2 * 4.0;
    uStack_650 = 0;
    fm2xm2y4z = (local_608 - (double)local_5d8._0_8_) + local_658;
    uStack_5c0 = 0;
    uStack_550 = 0;
    local_668 = -local_558;
    uStack_660 = 0x8000000000000000;
    uStack_520 = 0;
    local_678 = -facz_2;
    uStack_670 = 0x8000000000000000;
    dVar10 = *(double *)(&DAT_0067f160 + (ulong)((iVar153 - 0x66U & 0xfffffffb) == 0) * 8);
    do {
      MFIter::tilebox(&local_db8,&mfi_1);
      FVar34 = regular;
      if (bVar112) {
LAB_0057942d:
        bx_2.smallend.vect[0] = local_db8.smallend.vect[0] + -1;
        bx_2.smallend.vect[1] = local_db8.smallend.vect[1] + -1;
        bx_2.smallend.vect[2] = local_db8.smallend.vect[2] + -1;
        bx_2.bigend.vect[0] = local_db8.bigend.vect[0] + 1;
        bx_2.bigend.vect[1] = local_db8.bigend.vect[1] + 1;
        bx_2.bigend.vect[2] = local_db8.bigend.vect[2] + 1;
        lVar84 = 0;
        do {
          if ((local_db8.btype.itype >> ((uint)lVar84 & 0x1f) & 1) != 0) {
            piVar37 = bx_2.bigend.vect + lVar84;
            *piVar37 = *piVar37 + -1;
          }
          lVar84 = lVar84 + 1;
        } while (lVar84 != 3);
        bx_2.btype.itype = 0;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&bx_1,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,&mfi_1)
        ;
        lVar84 = (long)bx_2.smallend.vect[2];
        if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
          lVar36 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4;
          lVar80 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4;
          lVar35 = ((long)bx_2.smallend.vect[1] - (long)(int)local_bc4) * lVar80 +
                   (lVar84 - (int)local_bc0) * lVar36 + (long)bx_2.smallend.vect[0] * 4 +
                   (long)local_bc8 * -4 + bx_1.smallend.vect._0_8_;
          do {
            lVar49 = (long)bx_2.smallend.vect[1];
            lVar50 = lVar35;
            if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
              do {
                if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                  lVar61 = 0;
LAB_0057956f:
                  if (*(int *)(lVar50 + lVar61 * 4) != 0) goto code_r0x00579576;
                  BATransformer::operator()
                            ((Box *)local_6b8,
                             (BATransformer *)
                             (CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) + 8),
                             (Box *)((long)((mfi_1.index_map)->
                                           super_vector<int,_std::allocator<int>_>).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start[mfi_1.currentIndex] *
                                     0x1c + **(long **)(CONCAT44(mfi_1.fabArray._4_4_,
                                                                 (int)mfi_1.fabArray) + 0x50)));
                  bx_3.btype.itype = local_6b8._24_4_;
                  bx_3.bigend.vect[2] = local_6b8._20_4_;
                  bx_3.bigend.vect[1] = local_6b8._16_4_;
                  bx_3.smallend.vect[0] = local_6b8._0_4_;
                  bx_3.smallend.vect[1] = local_6b8._4_4_;
                  bx_3.smallend.vect[2] = local_6b8._8_4_;
                  bx_3.bigend.vect[0] = local_6b8._12_4_;
                  lVar84 = 0;
                  do {
                    if ((bx_3.btype.itype >> ((uint)lVar84 & 0x1f) & 1) != 0) {
                      piVar37 = bx_3.bigend.vect + lVar84;
                      *piVar37 = *piVar37 + -1;
                    }
                    lVar84 = lVar84 + 1;
                  } while (lVar84 != 3);
                  bx_3._20_8_ = bx_3._20_8_ & 0xffffffff;
                  FArrayBox::resize(&u,&bx_2,3,(Arena *)0x0);
                  DVar38 = u.super_BaseFab<double>.super_DataAllocator;
                  if (u.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
                    DVar38.m_arena = The_Arena();
                  }
                  Gpu::Elixir::Elixir(&ueli,(void *)0x0,DVar38.m_arena);
                  iVar28 = u.super_BaseFab<double>.domain.smallend.vect[2];
                  iVar105 = u.super_BaseFab<double>.domain.smallend.vect[1];
                  iVar69 = u.super_BaseFab<double>.domain.smallend.vect[0];
                  pdVar33 = u.super_BaseFab<double>.dptr;
                  lVar49 = (long)u.super_BaseFab<double>.domain.smallend.vect[0];
                  lVar80 = (long)u.super_BaseFab<double>.domain.smallend.vect[1];
                  lVar36 = (long)u.super_BaseFab<double>.domain.smallend.vect[2];
                  lVar84 = (long)((u.super_BaseFab<double>.domain.bigend.vect[1] -
                                  u.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
                  lVar35 = (long)((u.super_BaseFab<double>.domain.bigend.vect[2] -
                                  u.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
                  uVar134 = CONCAT44(-(uint)(bx_3.smallend.vect[1] < bx_2.smallend.vect[1]),
                                     -(uint)(bx_3.smallend.vect[0] < bx_2.smallend.vect[0]));
                  uVar134 = ~uVar134 & bx_3.smallend.vect._0_8_ |
                            CONCAT44(bx_2.smallend.vect[1],bx_2.smallend.vect[0]) & uVar134;
                  lhs.smallend.vect[0] = (int)uVar134;
                  lhs.smallend.vect[1] = (int)(uVar134 >> 0x20);
                  lhs.smallend.vect[2] = bx_3.smallend.vect[2];
                  if (bx_3.smallend.vect[2] < bx_2.smallend.vect[2]) {
                    lhs.smallend.vect[2] = bx_2.smallend.vect[2];
                  }
                  uVar134 = CONCAT44(-(uint)(bx_2.bigend.vect[1] < bx_3.bigend.vect[1]),
                                     -(uint)(bx_2.bigend.vect[0] < bx_3.bigend.vect[0]));
                  uVar134 = ~uVar134 & CONCAT44(bx_3.bigend.vect[1],bx_3.bigend.vect[0]) |
                            CONCAT44(bx_2.bigend.vect[1],bx_2.bigend.vect[0]) & uVar134;
                  lhs.bigend.vect[0] = (int)uVar134;
                  lhs.bigend.vect[1] = (int)(uVar134 >> 0x20);
                  lhs.bigend.vect[2] = bx_3.bigend.vect[2];
                  if (bx_2.bigend.vect[2] < bx_3.bigend.vect[2]) {
                    lhs.bigend.vect[2] = bx_2.bigend.vect[2];
                  }
                  lhs.btype.itype = bx_2.btype.itype;
                  paVar23 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  paVar24 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar50 = 0;
                  do {
                    if ((*(int *)((long)paVar23->_M_elems + lVar50) == 0x6a) &&
                       (iVar47 = *(int *)((long)lhs.smallend.vect + lVar50),
                       iVar47 == *(int *)((long)(domain->smallend).vect + lVar50))) {
                      *(int *)((long)lhs.smallend.vect + lVar50) = iVar47 + -1;
                    }
                    if ((*(int *)((long)paVar24->_M_elems + lVar50) == 0x6a) &&
                       (iVar47 = *(int *)((long)lhs.bigend.vect + lVar50),
                       iVar47 == *(int *)((long)(this_00->domain).bigend.vect + lVar50))) {
                      *(int *)((long)lhs.bigend.vect + lVar50) = iVar47 + 1;
                    }
                    lVar50 = lVar50 + 4;
                  } while (lVar50 != 0xc);
                  lVar50 = (long)((u.super_BaseFab<double>.domain.bigend.vect[0] -
                                  u.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
                  lVar62 = lVar84 * lVar50;
                  lVar63 = lVar62 * lVar35;
                  FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                            ((Array4<const_double> *)local_6b8,
                             &vold->super_FabArray<amrex::FArrayBox>,&mfi_1);
                  lVar61 = (long)bx_2.smallend.vect[2];
                  if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
                    lVar73 = (long)bx_2.smallend.vect[1];
                    lVar70 = (long)bx_2.smallend.vect[0];
                    local_f88 = (lVar73 * 8 + (lVar61 - lVar36) * lVar84 * 8 + lVar80 * -8) * lVar50
                                + lVar70 * 8 + lVar49 * -8 + (long)pdVar33;
                    local_f50 = ((lVar35 * 8 + lVar61 * 8 + lVar36 * -8) * lVar84 + lVar73 * 8 +
                                lVar80 * -8) * lVar50 + lVar70 * 8 + lVar49 * -8 + (long)pdVar33;
                    do {
                      if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
                        lVar74 = local_f88;
                        lVar75 = lVar73;
                        lVar93 = local_f50;
                        do {
                          if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                            lVar95 = (long)local_698;
                            lVar106 = (lVar61 - local_690) *
                                      CONCAT44(local_6b8._20_4_,local_6b8._16_4_);
                            lVar56 = (lVar75 - local_694) *
                                     CONCAT44(local_6b8._12_4_,local_6b8._8_4_);
                            lVar96 = 0;
                            lVar81 = lVar70;
                            do {
                              if ((((lVar96 + lVar70 < (long)lhs.smallend.vect[0]) ||
                                   (lVar75 < lhs.smallend.vect[1])) ||
                                  (lVar61 < lhs.smallend.vect[2])) ||
                                 ((((long)lhs.bigend.vect[0] < lVar96 + lVar70 ||
                                   (lhs.bigend.vect[1] < lVar75)) ||
                                  ((lhs.bigend.vect[2] < lVar61 ||
                                   (*(int *)((lVar75 - (int)local_bc4) *
                                             CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4
                                             + (lVar61 - (int)local_bc0) *
                                               CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4
                                             + (long)local_bc8 * -4 +
                                             bx_1.smallend.vect._0_8_ + lVar70 * 4 + lVar96 * 4) ==
                                    0)))))) {
                                lVar107 = (lVar70 - lVar49) + lVar96;
                                *(undefined8 *)(lVar74 + lVar96 * 8) = 0;
                                *(undefined8 *)(lVar93 + lVar96 * 8) = 0;
                                dVar119 = 0.0;
                              }
                              else {
                                lVar107 = lVar81 - lVar49;
                                *(double *)(lVar74 + lVar96 * 8) =
                                     *(double *)
                                      (local_6b8._0_8_ +
                                      (lVar70 + ((lVar106 + lVar56 + lVar96) - lVar95)) * 8);
                                *(double *)(lVar93 + lVar96 * 8) =
                                     *(double *)
                                      (local_6b8._0_8_ +
                                      (lVar70 + ((CONCAT44(uStack_69c,local_6b8._24_4_) +
                                                 lVar106 + lVar56 + lVar96) - lVar95)) * 8);
                                dVar119 = *(double *)
                                           (local_6b8._0_8_ +
                                           (lVar70 + ((lVar106 +
                                                      lVar56 + CONCAT44(uStack_69c,local_6b8._24_4_)
                                                               * 2 + lVar96) - lVar95)) * 8);
                              }
                              pdVar33[(lVar61 - lVar36) * lVar62 +
                                      (lVar75 - lVar80) * lVar50 + lVar63 * 2 + lVar107] = dVar119;
                              lVar81 = lVar81 + 1;
                              lVar96 = lVar96 + 1;
                            } while ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 !=
                                     (int)lVar96);
                          }
                          lVar75 = lVar75 + 1;
                          lVar74 = lVar74 + lVar50 * 8;
                          lVar93 = lVar93 + lVar50 * 8;
                        } while (bx_2.bigend.vect[1] + 1 != (int)lVar75);
                      }
                      lVar61 = lVar61 + 1;
                      local_f88 = local_f88 + lVar62 * 8;
                      local_f50 = local_f50 + lVar62 * 8;
                    } while (bx_2.bigend.vect[2] + 1 != (int)lVar61);
                  }
                  FArrayBox::resize(&rhs,&local_db8,1,(Arena *)0x0);
                  DVar38 = rhs.super_BaseFab<double>.super_DataAllocator;
                  if (rhs.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
                    DVar38.m_arena = The_Arena();
                  }
                  Gpu::Elixir::Elixir(&rhseli,(void *)0x0,DVar38.m_arena);
                  pdVar32 = rhs.super_BaseFab<double>.dptr;
                  lVar75 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[0];
                  lVar74 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[1];
                  lVar61 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[2];
                  lVar70 = (long)((rhs.super_BaseFab<double>.domain.bigend.vect[0] -
                                  rhs.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
                  lVar73 = (long)((rhs.super_BaseFab<double>.domain.bigend.vect[1] -
                                  rhs.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
                  FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                            (&local_af8,this_01,&mfi_1);
                  iVar47 = (int)uVar25;
                  if (FVar34 == singlevalued) {
                    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                              (&local_a78,local_b30,&mfi_1);
                    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                              (&local_9b0,
                               (FabArray<amrex::FArrayBox> *)
                               local_b28._M_t.
                               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi_1)
                    ;
                    local_f68 = (long)local_db8.smallend.vect[2];
                    if (local_db8.smallend.vect[2] <= local_db8.bigend.vect[2]) {
                      lVar81 = (long)local_db8.smallend.vect[1];
                      lVar107 = (long)local_db8.smallend.vect[0];
                      lVar63 = lVar81 * 8;
                      local_d18 = local_f68 + -1;
                      lVar95 = lVar35 * 0x10 + local_f68 * 8 + lVar36 * -8;
                      lVar93 = (lVar95 + -8) * lVar84 + lVar81 * 8 + lVar80 * -8;
                      lVar56 = ((local_f68 + lVar35) * 8 + lVar36 * -8 + -8) * lVar84 + lVar81 * 8 +
                               lVar80 * -8;
                      lVar96 = lVar63 + (local_d18 - lVar36) * lVar84 * 8 + lVar80 * -8;
                      lVar106 = lVar95 * lVar84 + lVar81 * 8 + lVar80 * -8;
                      lVar95 = (lVar35 * 8 + local_f68 * 8 + lVar36 * -8) * lVar84 + lVar81 * 8 +
                               lVar80 * -8;
                      lVar35 = lVar63 + (local_f68 - lVar36) * lVar84 * 8 + lVar80 * -8;
                      local_d28 = (lVar63 + (local_f68 - lVar61) * lVar73 * 8 + lVar74 * -8) *
                                  lVar70 + lVar107 * 8 + lVar75 * -8 + (long)pdVar32;
                      local_d78 = bx.bigend.vect[0] - lVar107;
                      local_d00 = (lVar93 + -8) * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33
                      ;
                      local_d08 = (lVar56 + -8) * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33
                      ;
                      local_ca8 = (lVar96 + -8) * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33
                      ;
                      local_cb0 = (lVar106 + -8) * lVar50 + lVar107 * 8 + lVar49 * -8 +
                                  (long)pdVar33;
                      local_cb8 = (lVar95 + -8) * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33
                      ;
                      local_cc0 = (lVar35 + -8) * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33
                      ;
                      local_cc8 = lVar93 * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33;
                      local_d38 = lVar56 * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33;
                      local_c20 = lVar96 * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33;
                      local_c28 = lVar106 * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33;
                      local_c30 = lVar95 * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33;
                      local_c38 = lVar35 * lVar50 + lVar107 * 8 + lVar49 * -8 + (long)pdVar33;
                      local_d90 = CONCAT44(local_d90._4_4_,local_db8.bigend.vect[0]);
                      local_d80 = (long)bx.smallend.vect[1];
                      lVar35 = lVar107 * 8;
                      lVar63 = lVar62 * 8;
                      lVar93 = lVar50 * 8;
                      do {
                        if (local_db8.smallend.vect[1] <= local_db8.bigend.vect[1]) {
                          lVar56 = (long)local_af8.p +
                                   (lVar81 - local_af8.begin.y) * local_af8.jstride * 4 +
                                   (local_f68 - local_af8.begin.z) * local_af8.kstride * 4 +
                                   (long)local_af8.begin.x * -4 + lVar107 * 4;
                          local_e28 = local_c38;
                          local_ea0 = (double *)local_c30;
                          local_ef8 = local_c28;
                          local_f08 = local_c20;
                          local_e68 = local_d38;
                          local_e00 = local_cc8;
                          local_e08 = local_cc0;
                          local_e30 = local_cb8;
                          local_e38 = local_cb0;
                          local_de0 = local_ca8;
                          local_e10 = local_d08;
                          local_ea8 = local_d00;
                          local_ff0 = local_d28;
                          local_f20 = lVar81;
                          local_d88 = lVar81 + -1;
                          do {
                            if (local_db8.smallend.vect[0] <= local_db8.bigend.vect[0]) {
                              lVar39 = (long)local_9b0.begin.x;
                              lVar89 = (local_d18 - local_9b0.begin.z) * local_9b0.kstride * 8;
                              lVar51 = (local_d88 - local_9b0.begin.y) * local_9b0.jstride * 8;
                              lVar95 = lVar89 + lVar51;
                              lVar97 = local_9b0.nstride * 0x38;
                              lVar96 = (local_f68 - local_9b0.begin.z) * local_9b0.kstride * 8;
                              lVar51 = lVar51 + lVar96;
                              lVar108 = (local_f20 - local_9b0.begin.y) * local_9b0.jstride * 8;
                              lVar89 = lVar89 + lVar108;
                              lVar108 = lVar108 + lVar96;
                              lVar76 = local_9b0.nstride * 0x10;
                              lVar96 = local_9b0.nstride * 0x30;
                              lVar55 = local_9b0.nstride * 0x40;
                              lVar106 = lVar96 + lVar95 + lVar39 * -8 + lVar35;
                              lVar101 = lVar97 + lVar95 + lVar39 * -8 + lVar35;
                              lVar79 = lVar95 + lVar39 * -8 + lVar35;
                              lVar100 = lVar95 + lVar55 + lVar39 * -8 + lVar35;
                              lVar59 = lVar95 + lVar76 + lVar39 * -8 + lVar35;
                              lVar95 = local_9b0.nstride * 8 + lVar95 + lVar39 * -8 + lVar35;
                              lVar41 = lVar51 + lVar96 + lVar39 * -8 + lVar35;
                              lVar42 = lVar51 + lVar97 + lVar39 * -8 + lVar35;
                              lVar43 = lVar51 + lVar39 * -8 + lVar35;
                              lVar44 = lVar51 + lVar55 + lVar39 * -8 + lVar35;
                              lVar45 = lVar51 + lVar76 + lVar39 * -8 + lVar35;
                              lVar51 = lVar51 + local_9b0.nstride * 8 + lVar39 * -8 + lVar35;
                              lVar65 = lVar89 + lVar96 + lVar39 * -8 + lVar35;
                              lVar104 = lVar89 + lVar97 + lVar39 * -8 + lVar35;
                              lVar58 = lVar89 + lVar39 * -8 + lVar35;
                              lVar77 = lVar89 + lVar55 + lVar39 * -8 + lVar35;
                              lVar92 = lVar89 + lVar76 + lVar39 * -8 + lVar35;
                              lVar89 = lVar89 + local_9b0.nstride * 8 + lVar39 * -8 + lVar35;
                              lVar96 = lVar96 + lVar108 + lVar39 * -8 + lVar35;
                              lVar97 = lVar97 + lVar108 + lVar39 * -8 + lVar35;
                              lVar46 = lVar108 + lVar39 * -8 + lVar35;
                              lVar55 = lVar55 + lVar108 + lVar39 * -8 + lVar35;
                              lVar76 = lVar76 + lVar108 + lVar39 * -8 + lVar35;
                              lVar39 = lVar108 + local_9b0.nstride * 8 + lVar39 * -8 + lVar35;
                              lVar103 = (local_d18 - local_a78.begin.z) * local_a78.kstride * 8;
                              lVar85 = (local_f68 - local_a78.begin.z) * local_a78.kstride * 8;
                              lVar64 = (local_d88 - local_a78.begin.y) * local_a78.jstride * 8;
                              lVar40 = (local_f20 - local_a78.begin.y) * local_a78.jstride * 8;
                              lVar86 = (long)local_a78.begin.x;
                              lVar108 = lVar103 + lVar64 + lVar86 * -8 + lVar35;
                              lVar64 = lVar64 + lVar85 + lVar86 * -8 + lVar35;
                              lVar103 = lVar103 + lVar40 + lVar86 * -8 + lVar35;
                              lVar40 = lVar40 + lVar85 + lVar86 * -8 + lVar35;
                              lVar85 = 0;
                              do {
                                dVar119 = 0.0;
                                if (*(int *)(lVar56 + lVar85 * 4) == 0) {
                                  if (iVar47 == 0x66) {
                                    dVar119 = 1.0;
                                    if (bx.smallend.vect[0] - lVar107 == lVar85) {
LAB_0057a6f9:
                                      dVar119 = 0.0;
                                    }
                                  }
                                  else {
                                    dVar119 = 1.0;
                                    if (iVar47 == 0x6a && bx.smallend.vect[0] - lVar107 == lVar85)
                                    goto LAB_0057a6f9;
                                  }
                                  dVar128 = 1.0;
                                  if (((iVar153 == 0x66) || (iVar153 == 0x6a)) &&
                                     (dVar128 = 1.0, local_d78 == lVar85)) {
                                    dVar128 = 0.0;
                                  }
                                  if ((int)local_d70 == 0x66) {
                                    dVar137 = 1.0;
                                    if (local_f20 == local_d80) {
LAB_0057a771:
                                      dVar137 = 0.0;
                                    }
                                  }
                                  else {
                                    dVar137 = 1.0;
                                    if (local_f20 == local_d80 && local_d70 == 0x6a)
                                    goto LAB_0057a771;
                                  }
                                  if (iVar154 == 0x66) {
                                    dVar139 = 1.0;
                                    if (local_f20 == bx.bigend.vect[1]) {
LAB_0057a7a5:
                                      dVar139 = 0.0;
                                    }
                                  }
                                  else {
                                    dVar139 = 1.0;
                                    if (local_f20 == bx.bigend.vect[1] && uVar26 >> 0x20 == 0x6a)
                                    goto LAB_0057a7a5;
                                  }
                                  if (LVar21 == Neumann) {
                                    dVar140 = 1.0;
                                    if (local_f68 == bx.smallend.vect[2]) {
LAB_0057a7d9:
                                      dVar140 = 0.0;
                                    }
                                  }
                                  else {
                                    dVar140 = 1.0;
                                    if (local_f68 == bx.smallend.vect[2] && LVar21 == inflow)
                                    goto LAB_0057a7d9;
                                  }
                                  dVar145 = 1.0;
                                  if (LVar22 == Neumann) {
                                    if (local_f68 == bx.bigend.vect[2]) {
LAB_0057a818:
                                      dVar145 = 0.0;
                                    }
                                  }
                                  else if (local_f68 == bx.bigend.vect[2] && LVar22 == inflow)
                                  goto LAB_0057a818;
                                  dVar11 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar51 + -8)
                                  ;
                                  dVar113 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar51);
                                  dVar122 = *(double *)
                                             ((long)local_a78.p + lVar85 * 8 + lVar64 + -8);
                                  dVar130 = *(double *)((long)local_a78.p + lVar85 * 8 + lVar64);
                                  dVar123 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar45 + -8);
                                  dVar123 = dVar123 + dVar123;
                                  dVar124 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar45);
                                  dVar113 = dVar113 + dVar113;
                                  dVar124 = dVar124 + dVar124;
                                  dVar114 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar39 + -8);
                                  dVar12 = *(double *)((long)local_a78.p + lVar85 * 8 + lVar40 + -8)
                                  ;
                                  dVar114 = dVar114 + dVar114;
                                  dVar150 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar46 + -8);
                                  dVar142 = dVar150 + dVar150 + dVar12;
                                  dVar150 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar76 + -8);
                                  dVar150 = dVar150 + dVar150;
                                  dVar115 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar39) *
                                            -2.0;
                                  dVar13 = *(double *)((long)local_a78.p + lVar85 * 8 + lVar40);
                                  dVar135 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar76) *
                                            -2.0;
                                  dVar116 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar95 + -8) * -2.0;
                                  dVar14 = *(double *)
                                            ((long)local_a78.p + lVar85 * 8 + lVar108 + -8);
                                  dVar125 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar59 + -8) * -2.0;
                                  dVar117 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar95);
                                  dVar117 = dVar117 + dVar117;
                                  dVar118 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar79);
                                  dVar15 = *(double *)((long)local_a78.p + lVar85 * 8 + lVar108);
                                  dVar143 = (dVar118 + dVar118) - dVar15;
                                  dVar118 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar59);
                                  dVar118 = dVar118 + dVar118;
                                  dVar126 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar89 + -8);
                                  dVar126 = dVar126 + dVar126;
                                  dVar16 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar58 + -8)
                                  ;
                                  dVar17 = *(double *)
                                            ((long)local_a78.p + lVar85 * 8 + lVar103 + -8);
                                  dVar127 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar92 + -8);
                                  dVar127 = dVar127 + dVar127;
                                  dVar136 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar89);
                                  dVar136 = dVar136 + dVar136;
                                  dVar149 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar58);
                                  dVar149 = dVar149 + dVar149;
                                  dVar18 = *(double *)((long)local_a78.p + lVar85 * 8 + lVar103);
                                  dVar148 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar92);
                                  dVar148 = dVar148 + dVar148;
                                  dVar19 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar43 + -8)
                                  ;
                                  dVar146 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar43);
                                  dVar146 = dVar146 + dVar146;
                                  dVar147 = *(double *)((long)local_9b0.p + lVar85 * 8 + lVar46);
                                  dVar151 = dVar13 - (dVar147 + dVar147);
                                  dVar147 = *(double *)
                                             ((long)local_9b0.p + lVar85 * 8 + lVar79 + -8) * -2.0 -
                                            dVar14;
                                  dVar119 = ((*(double *)((long)local_9b0.p + lVar85 * 8 + lVar65) *
                                              -4.0 + (dVar149 - dVar18) + dVar136) *
                                             *(double *)(local_e00 + lVar85 * 8) * dVar128 * dVar139
                                            + (*(double *)
                                                ((long)local_9b0.p + lVar85 * 8 + lVar65 + -8) * 4.0
                                              + (dVar16 * -2.0 - dVar17) + dVar126) *
                                              *(double *)(local_e00 + -8 + lVar85 * 8) * dVar119 *
                                              dVar139 + (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar106)
                                                         * 4.0 + (dVar143 - dVar117)) *
                                                        *(double *)(local_ea8 + lVar85 * 8) *
                                                        dVar128 * dVar137 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar106 + -8) * -4.0 +
                                                        dVar147 + dVar116) *
                                                        *(double *)(local_ea8 + -8 + lVar85 * 8) *
                                                        dVar119 * dVar137 +
                                                        (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar96)
                                                         * 4.0 + dVar151 + dVar115) *
                                                        *(double *)(local_ef8 + lVar85 * 8) *
                                                        dVar128 * dVar139 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar96 + -8) * -4.0 +
                                                        (dVar142 - dVar114)) *
                                                        *(double *)(local_ef8 + -8 + lVar85 * 8) *
                                                        dVar119 * dVar139 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar41 + -8) * 4.0 +
                                                        dVar11 + dVar11 + dVar19 + dVar19 + dVar122)
                                                        * *(double *)(local_e38 + -8 + lVar85 * 8) *
                                                        dVar119 * dVar137 +
                                                        (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar41)
                                                         * -4.0 + (dVar130 - dVar146) + dVar113) *
                                                        *(double *)(local_e38 + lVar85 * 8) *
                                                        dVar128 * dVar137) * dVar9 * 0.25 +
                                            ((*(double *)((long)local_9b0.p + lVar85 * 8 + lVar77) *
                                              -4.0 + (dVar18 - dVar136) + dVar148) *
                                             *(double *)(local_f08 + lVar85 * 8) * dVar139 * dVar140
                                            + (*(double *)
                                                ((long)local_9b0.p + lVar85 * 8 + lVar77 + -8) * 4.0
                                              + ((dVar126 - dVar17) - dVar127)) *
                                              *(double *)(local_f08 + -8 + lVar85 * 8) * dVar139 *
                                              dVar140 + (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar100)
                                                         * 4.0 + dVar117 + dVar15 + dVar118) *
                                                        *(double *)(local_de0 + lVar85 * 8) *
                                                        dVar137 * dVar140 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar100 + -8) * -4.0 +
                                                        (dVar116 - dVar14) + dVar125) *
                                                        *(double *)(local_de0 + -8 + lVar85 * 8) *
                                                        dVar137 * dVar140 +
                                                        (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar55)
                                                         * 4.0 + dVar115 + dVar13 + dVar135) *
                                                        *(double *)(local_e28 + lVar85 * 8) *
                                                        dVar139 * dVar145 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar55 + -8) * -4.0 +
                                                        (dVar114 - dVar12) + dVar150) *
                                                        *(double *)(local_e28 + -8 + lVar85 * 8) *
                                                        dVar139 * dVar145 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar44 + -8) * 4.0 +
                                                        (dVar11 * -2.0 - dVar122) + dVar123) *
                                                        *(double *)(local_e08 + -8 + lVar85 * 8) *
                                                        dVar137 * dVar145 +
                                                        (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar44)
                                                         * -4.0 + ((dVar113 + dVar130) - dVar124)) *
                                                        *(double *)(local_e08 + lVar85 * 8) *
                                                        dVar137 * dVar145) * dVar7 * 0.25 +
                                            ((*(double *)((long)local_9b0.p + lVar85 * 8 + lVar104)
                                              * -4.0 + (dVar18 - dVar149) + dVar148) *
                                             *(double *)(local_e68 + lVar85 * 8) * dVar128 * dVar140
                                            + (*(double *)
                                                ((long)local_9b0.p + lVar85 * 8 + lVar104 + -8) *
                                               4.0 + dVar16 + dVar16 + dVar17 + dVar127) *
                                              *(double *)(local_e68 + -8 + lVar85 * 8) * dVar119 *
                                              dVar140 + (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar101)
                                                         * 4.0 + (dVar143 - dVar118)) *
                                                        *(double *)(local_e10 + lVar85 * 8) *
                                                        dVar128 * dVar140 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar101 + -8) * -4.0 +
                                                        dVar125 + dVar147) *
                                                        *(double *)(local_e10 + -8 + lVar85 * 8) *
                                                        dVar119 * dVar140 +
                                                        (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar97)
                                                         * 4.0 + dVar135 + dVar151) *
                                                        *(double *)((long)local_ea0 + lVar85 * 8) *
                                                        dVar128 * dVar145 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar97 + -8) * -4.0 +
                                                        (dVar142 - dVar150)) *
                                                        *(double *)
                                                         ((long)local_ea0 + -8 + lVar85 * 8) *
                                                        dVar119 * dVar145 +
                                                        (*(double *)
                                                          ((long)local_9b0.p +
                                                          lVar85 * 8 + lVar42 + -8) * 4.0 +
                                                        (dVar19 * -2.0 - dVar122) + dVar123) *
                                                        *(double *)(local_e30 + -8 + lVar85 * 8) *
                                                        dVar119 * dVar145 +
                                                        (*(double *)
                                                          ((long)local_9b0.p + lVar85 * 8 + lVar42)
                                                         * -4.0 + (dVar146 - dVar130) + dVar124) *
                                                        *(double *)(local_e30 + lVar85 * 8) *
                                                        dVar128 * dVar145) * dVar8 * 0.25;
                                }
                                *(double *)(local_ff0 + lVar85 * 8) = dVar119;
                                lVar85 = lVar85 + 1;
                              } while ((local_db8.bigend.vect[0] - local_db8.smallend.vect[0]) + 1
                                       != (int)lVar85);
                            }
                            local_f20 = local_f20 + 1;
                            local_ff0 = local_ff0 + lVar70 * 8;
                            local_d88 = local_d88 + 1;
                            local_ea8 = local_ea8 + lVar93;
                            local_e10 = local_e10 + lVar93;
                            local_de0 = local_de0 + lVar93;
                            local_e38 = local_e38 + lVar93;
                            local_e30 = local_e30 + lVar93;
                            local_e08 = local_e08 + lVar93;
                            local_e00 = local_e00 + lVar93;
                            local_e68 = local_e68 + lVar93;
                            local_f08 = local_f08 + lVar93;
                            local_ef8 = local_ef8 + lVar93;
                            local_ea0 = (double *)((long)local_ea0 + lVar93);
                            local_e28 = local_e28 + lVar93;
                            lVar56 = lVar56 + local_af8.jstride * 4;
                          } while (local_db8.bigend.vect[1] + 1 != (int)local_f20);
                        }
                        local_f68 = local_f68 + 1;
                        local_d28 = local_d28 + lVar73 * lVar70 * 8;
                        local_d18 = local_d18 + 1;
                        local_d00 = local_d00 + lVar63;
                        local_d08 = local_d08 + lVar63;
                        local_ca8 = local_ca8 + lVar63;
                        local_cb0 = local_cb0 + lVar63;
                        local_cb8 = local_cb8 + lVar63;
                        local_cc0 = local_cc0 + lVar63;
                        local_cc8 = local_cc8 + lVar63;
                        local_d38 = local_d38 + lVar63;
                        local_c20 = local_c20 + lVar63;
                        local_c28 = local_c28 + lVar63;
                        local_c30 = local_c30 + lVar63;
                        local_c38 = local_c38 + lVar63;
                      } while (local_db8.bigend.vect[2] + 1 != (int)local_f68);
                    }
                  }
                  else {
                    local_f88 = (long)local_db8.smallend.vect[2];
                    if (local_db8.smallend.vect[2] <= local_db8.bigend.vect[2]) {
                      lVar95 = (long)local_db8.smallend.vect[1];
                      lVar107 = (long)local_db8.smallend.vect[0];
                      lVar93 = lVar95 * 8;
                      lVar96 = (lVar35 * 0x10 + local_f88 * 8 + lVar36 * -8) * lVar84;
                      lVar81 = (lVar35 * 8 + local_f88 * 8 + lVar36 * -8) * lVar84;
                      lVar56 = (local_f88 - lVar36) * lVar84;
                      local_ea8 = (lVar93 + (local_f88 - lVar61) * lVar73 * 8 + lVar74 * -8) *
                                  lVar70 + lVar107 * 8 + lVar75 * -8 + (long)pdVar32;
                      lVar101 = lVar93 + lVar80 * -8;
                      pdVar54 = pdVar33 + (lVar107 - lVar49);
                      lVar106 = lVar84 * 8 * lVar50;
                      iVar48 = ~iVar28 + local_db8.smallend.vect[2];
                      local_e40 = (lVar96 + lVar95 * 8 + lVar80 * -8) * lVar50 + lVar107 * 8 +
                                  lVar49 * -8 + (long)pdVar33;
                      local_e48 = (lVar81 + lVar95 * 8 + lVar80 * -8) * lVar50 + lVar107 * 8 +
                                  lVar49 * -8 + (long)pdVar33;
                      local_e50 = (lVar93 + lVar56 * 8 + lVar80 * -8) * lVar50 + lVar107 * 8 +
                                  lVar49 * -8 + (long)pdVar33;
                      lVar93 = lVar50 * 8;
                      local_ea0 = pdVar54;
                      do {
                        if (local_db8.smallend.vect[1] <= local_db8.bigend.vect[1]) {
                          lVar51 = (long)iVar48;
                          lVar44 = (lVar35 * 0x10 + lVar51 * 8) * lVar84;
                          lVar65 = (lVar35 * 8 + lVar51 * 8) * lVar84;
                          lVar51 = lVar51 * lVar84 * 8;
                          local_fb8 = (double *)((lVar101 + lVar44) * lVar50 + (long)pdVar54);
                          local_fe8 = (double *)((lVar65 + lVar101) * lVar50 + (long)pdVar54);
                          local_fa0 = (double *)((lVar101 + lVar51) * lVar50 + (long)pdVar54);
                          lVar45 = (~iVar28 + (int)local_f88) * lVar62;
                          lVar43 = (local_f88 - lVar36) * lVar62;
                          lVar104 = (long)local_af8.p +
                                    (lVar95 - local_af8.begin.y) * local_af8.jstride * 4 +
                                    (local_f88 - local_af8.begin.z) * local_af8.kstride * 4 +
                                    (long)local_af8.begin.x * -4 + lVar107 * 4;
                          lVar79 = local_e48;
                          lVar100 = local_e40;
                          lVar59 = local_ea8;
                          lVar41 = lVar95;
                          lVar42 = local_e50;
                          iVar66 = ~iVar105 + local_db8.smallend.vect[1];
                          do {
                            if (local_db8.smallend.vect[0] <= local_db8.bigend.vect[0]) {
                              lVar58 = (long)iVar66;
                              lVar77 = (~iVar105 + (int)lVar41) * lVar50;
                              lVar92 = (lVar41 - lVar80) * lVar50;
                              lVar89 = 0;
                              do {
                                dVar119 = 0.0;
                                if (*(int *)(lVar104 + lVar89 * 4) == 0) {
                                  if (iVar47 == 0x66) {
                                    dVar119 = 1.0;
                                    if (bx.smallend.vect[0] - lVar107 == lVar89) {
LAB_0057b862:
                                      dVar119 = 0.0;
                                    }
                                  }
                                  else {
                                    dVar119 = 1.0;
                                    if (iVar47 == 0x6a && bx.smallend.vect[0] - lVar107 == lVar89)
                                    goto LAB_0057b862;
                                  }
                                  if (((iVar153 == 0x66) || (dVar128 = 1.0, iVar153 == 0x6a)) &&
                                     (dVar128 = 1.0, bx.bigend.vect[0] - lVar107 == lVar89)) {
                                    dVar128 = 0.0;
                                  }
                                  if ((int)local_d70 == 0x66) {
                                    dVar137 = 1.0;
                                    if (lVar41 == bx.smallend.vect[1]) {
LAB_0057b8b0:
                                      dVar137 = 0.0;
                                    }
                                  }
                                  else {
                                    dVar137 = 1.0;
                                    if (lVar41 == bx.smallend.vect[1] && local_d70 == 0x6a)
                                    goto LAB_0057b8b0;
                                  }
                                  dVar139 = 1.0;
                                  if (iVar154 == 0x66) {
                                    if (lVar41 == bx.bigend.vect[1]) {
LAB_0057b8d3:
                                      dVar139 = 0.0;
                                    }
                                  }
                                  else if (lVar41 == bx.bigend.vect[1] && uVar26 >> 0x20 == 0x6a)
                                  goto LAB_0057b8d3;
                                  if (LVar21 == Neumann) {
                                    dVar140 = 1.0;
                                    if (local_f88 == bx.smallend.vect[2]) {
LAB_0057b904:
                                      dVar140 = 0.0;
                                    }
                                  }
                                  else {
                                    dVar140 = 1.0;
                                    if (local_f88 == bx.smallend.vect[2] && LVar21 == inflow)
                                    goto LAB_0057b904;
                                  }
                                  dVar145 = 1.0;
                                  if (LVar22 == Neumann) {
                                    if (local_f88 == bx.bigend.vect[2]) {
LAB_0057b93d:
                                      dVar145 = 0.0;
                                    }
                                  }
                                  else if (local_f88 == bx.bigend.vect[2] && LVar22 == inflow)
                                  goto LAB_0057b93d;
                                  lVar97 = (long)(~iVar69 + local_db8.smallend.vect[0] + (int)lVar89
                                                 );
                                  pdVar78 = pdVar33 + lVar77 + lVar97 + lVar45;
                                  pdVar1 = pdVar33 + lVar92 + lVar97 + lVar45;
                                  pdVar2 = pdVar33 + lVar77 + lVar97 + lVar43;
                                  pdVar3 = pdVar33 + lVar92 + lVar97 + lVar43;
                                  dVar119 = (dVar128 * *(double *)(lVar100 + lVar89 * 8) * dVar139 +
                                            dVar119 * pdVar3[lVar63 * 2] * dVar139 +
                                            *(double *)
                                             ((long)local_ea0 +
                                             lVar89 * 8 + (lVar96 + lVar58 * 8) * lVar50) * dVar128
                                            * dVar137 +
                                            pdVar2[lVar63 * 2] * dVar119 * dVar137 +
                                            (((-pdVar78[lVar63 * 2] * dVar119 * dVar137 -
                                              *(double *)
                                               ((long)pdVar54 +
                                               lVar89 * 8 + (lVar44 + lVar58 * 8) * lVar50) *
                                              dVar128 * dVar137) -
                                             pdVar1[lVar63 * 2] * dVar119 * dVar139) -
                                            local_fb8[lVar89] * dVar128 * dVar139)) * dVar9 * 0.25 +
                                            (*(double *)(lVar42 + lVar89 * 8) * dVar139 * dVar145 +
                                            ((*(double *)
                                               ((long)local_ea0 +
                                               lVar89 * 8 + (lVar56 * 8 + lVar58 * 8) * lVar50) *
                                              dVar137 * dVar145 +
                                             ((local_fa0[lVar89] * dVar139 * dVar140 +
                                              ((*(double *)
                                                 ((long)pdVar54 +
                                                 lVar89 * 8 + (lVar51 + lVar58 * 8) * lVar50) *
                                                dVar137 * dVar140 - *pdVar78 * dVar137 * dVar140) -
                                              *pdVar1 * dVar139 * dVar140)) -
                                             *pdVar2 * dVar137 * dVar145)) -
                                            *pdVar3 * dVar139 * dVar145)) * dVar7 * 0.25 +
                                            (*(double *)(lVar79 + lVar89 * 8) * dVar128 * dVar145 +
                                            pdVar3[lVar63] * dVar119 * dVar145 +
                                            (((local_fe8[lVar89] * dVar128 * dVar140 +
                                              pdVar1[lVar63] * dVar119 * dVar140 +
                                              (-pdVar78[lVar63] * dVar119 * dVar140 -
                                              *(double *)
                                               ((long)pdVar54 +
                                               lVar89 * 8 + (lVar65 + lVar58 * 8) * lVar50) *
                                              dVar128 * dVar140)) -
                                             pdVar2[lVar63] * dVar119 * dVar145) -
                                            *(double *)
                                             ((long)local_ea0 +
                                             lVar89 * 8 + (lVar81 + lVar58 * 8) * lVar50) * dVar128
                                            * dVar145)) * dVar8 * 0.25;
                                }
                                *(double *)(lVar59 + lVar89 * 8) = dVar119;
                                lVar89 = lVar89 + 1;
                              } while ((local_db8.bigend.vect[0] - local_db8.smallend.vect[0]) + 1
                                       != (int)lVar89);
                            }
                            lVar41 = lVar41 + 1;
                            lVar59 = lVar59 + lVar70 * 8;
                            lVar104 = lVar104 + local_af8.jstride * 4;
                            iVar66 = iVar66 + 1;
                            lVar100 = lVar100 + lVar93;
                            lVar79 = lVar79 + lVar93;
                            lVar42 = lVar42 + lVar93;
                            local_fb8 = local_fb8 + lVar50;
                            local_fe8 = local_fe8 + lVar50;
                            local_fa0 = local_fa0 + lVar50;
                          } while (local_db8.bigend.vect[1] + 1 != (int)lVar41);
                        }
                        local_f88 = local_f88 + 1;
                        local_ea8 = local_ea8 + lVar73 * lVar70 * 8;
                        local_ea0 = (double *)((long)local_ea0 + lVar106);
                        iVar48 = iVar48 + 1;
                        local_e40 = local_e40 + lVar106;
                        local_e48 = local_e48 + lVar106;
                        local_e50 = local_e50 + lVar106;
                      } while (local_db8.bigend.vect[2] + 1 != (int)local_f88);
                    }
                  }
                  if (rhcc != (MultiFab *)0x0) {
                    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                              (&local_a78,&rhcc->super_FabArray<amrex::FArrayBox>,&mfi_1);
                    lVar35 = (long)bx_2.smallend.vect[2];
                    if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
                      iVar48 = bx_3.bigend.vect[2];
                      if (bx_2.bigend.vect[2] < bx_3.bigend.vect[2]) {
                        iVar48 = bx_2.bigend.vect[2];
                      }
                      if (bx_2.bigend.vect[1] < bx_3.bigend.vect[1]) {
                        bx_3.bigend.vect[1] = bx_2.bigend.vect[1];
                      }
                      if (bx_2.bigend.vect[0] < bx_3.bigend.vect[0]) {
                        bx_3.bigend.vect[0] = bx_2.bigend.vect[0];
                      }
                      if (bx_3.smallend.vect[2] < bx_2.smallend.vect[2]) {
                        bx_3.smallend.vect[2] = bx_2.smallend.vect[2];
                      }
                      iVar66 = bx_3.smallend.vect[1];
                      if (bx_3.smallend.vect[1] < bx_2.smallend.vect[1]) {
                        iVar66 = bx_2.smallend.vect[1];
                      }
                      lVar63 = (long)bx_2.smallend.vect[0];
                      iVar67 = bx_3.smallend.vect[0];
                      if (bx_3.smallend.vect[0] < bx_2.smallend.vect[0]) {
                        iVar67 = bx_2.smallend.vect[0];
                      }
                      lVar93 = ((long)bx_2.smallend.vect[1] * 8 + (lVar35 - lVar36) * lVar84 * 8 +
                               lVar80 * -8) * lVar50 + lVar63 * 8 + lVar49 * -8 + (long)pdVar33;
                      do {
                        lVar81 = (long)bx_2.smallend.vect[1];
                        lVar56 = lVar93;
                        if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
                          do {
                            if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                              lVar95 = 0;
                              do {
                                dVar119 = 0.0;
                                if (((((long)iVar67 <= lVar63 + lVar95) && (iVar66 <= lVar81)) &&
                                    ((bx_3.smallend.vect[2] <= lVar35 &&
                                     ((lVar63 + lVar95 <= (long)bx_3.bigend.vect[0] &&
                                      (lVar81 <= bx_3.bigend.vect[1])))))) &&
                                   ((lVar35 <= iVar48 &&
                                    (*(int *)((lVar81 - (int)local_bc4) *
                                              CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) *
                                              4 + (lVar35 - (int)local_bc0) *
                                                  CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1])
                                                  * 4 + (long)local_bc8 * -4 +
                                              bx_1.smallend.vect._0_8_ + lVar63 * 4 + lVar95 * 4) !=
                                     0)))) {
                                  dVar119 = local_a78.p
                                            [lVar63 + (((lVar35 - local_a78.begin.z) *
                                                        local_a78.kstride +
                                                       (lVar81 - local_a78.begin.y) *
                                                       local_a78.jstride + lVar95) -
                                                      (long)local_a78.begin.x)];
                                }
                                *(double *)(lVar56 + lVar95 * 8) = dVar119;
                                lVar95 = lVar95 + 1;
                              } while ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 !=
                                       (int)lVar95);
                            }
                            lVar81 = lVar81 + 1;
                            lVar56 = lVar56 + lVar50 * 8;
                          } while (bx_2.bigend.vect[1] + 1 != (int)lVar81);
                        }
                        lVar35 = lVar35 + 1;
                        lVar93 = lVar93 + lVar62 * 8;
                      } while (bx_2.bigend.vect[2] + 1 != (int)lVar35);
                    }
                    if (FVar34 == singlevalued) {
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                (&local_9b0,local_b30,&mfi_1);
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                ((Array4<const_double> *)&bx_6,
                                 (FabArray<amrex::FArrayBox> *)
                                 local_b28._M_t.
                                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                 .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                                 &mfi_1);
                      local_f08 = (long)local_db8.smallend.vect[2];
                      if (local_db8.smallend.vect[2] <= local_db8.bigend.vect[2]) {
                        lVar81 = (long)local_db8.smallend.vect[1];
                        lVar56 = (long)local_db8.smallend.vect[0];
                        lVar35 = lVar81 * 8;
                        lVar63 = lVar56 * 8;
                        local_e48 = (lVar35 + (local_f08 - lVar61) * lVar73 * 8 + lVar74 * -8) *
                                    lVar70 + lVar56 * 8 + lVar75 * -8 + (long)pdVar32;
                        local_ea8 = local_f08 + -1;
                        lVar93 = lVar35 + (local_ea8 - lVar36) * lVar84 * 8 + lVar80 * -8;
                        local_e50 = lVar93 * lVar50 + lVar56 * 8 + lVar49 * -8 + (long)pdVar33;
                        lVar35 = lVar35 + (local_f08 - lVar36) * lVar84 * 8 + lVar80 * -8;
                        local_e58 = lVar35 * lVar50 + lVar56 * 8 + lVar49 * -8 + (long)pdVar33;
                        local_ed8 = (lVar93 + -8) * lVar50 + lVar56 * 8 + lVar49 * -8 +
                                    (long)pdVar33;
                        local_e18 = (lVar35 + -8) * lVar50 + lVar56 * 8 + lVar49 * -8 +
                                    (long)pdVar33;
                        lVar35 = lVar62 * 8;
                        lVar93 = lVar50 * 8;
                        do {
                          if (local_db8.smallend.vect[1] <= local_db8.bigend.vect[1]) {
                            local_ff0 = (long)local_af8.p +
                                        (lVar81 - local_af8.begin.y) * local_af8.jstride * 4 +
                                        (local_f08 - local_af8.begin.z) * local_af8.kstride * 4 +
                                        (long)local_af8.begin.x * -4 + lVar56 * 4;
                            local_fb8 = (double *)local_e18;
                            local_fe8 = (double *)local_ed8;
                            local_fa0 = (double *)local_e58;
                            local_fc0 = local_e50;
                            lVar95 = local_e48;
                            local_ef8 = lVar81 + -1;
                            local_ea0 = (double *)lVar81;
                            do {
                              if (local_db8.smallend.vect[0] <= local_db8.bigend.vect[0]) {
                                lVar106 = (long)local_9b0.begin.x;
                                lVar77 = CONCAT44(uStack_9fc,bx_6.btype.itype);
                                lVar96 = (local_ea8 - local_9b0.begin.z) * local_9b0.kstride * 8;
                                lVar107 = ((long)local_ea0 - (long)local_9b0.begin.y) *
                                          local_9b0.jstride * 8;
                                lVar92 = lVar96 + lVar107 + lVar106 * -8 + lVar63;
                                lVar101 = (local_f08 - local_9b0.begin.z) * local_9b0.kstride * 8;
                                lVar89 = lVar107 + lVar101 + lVar106 * -8 + lVar63;
                                lVar107 = (local_ef8 - local_9b0.begin.y) * local_9b0.jstride * 8;
                                lVar97 = lVar96 + lVar107 + lVar106 * -8 + lVar63;
                                lVar46 = lVar107 + lVar101 + lVar106 * -8 + lVar63;
                                lVar106 = CONCAT44(bx_6.bigend.vect[2],bx_6.bigend.vect[1]) * 8;
                                lVar65 = (local_ea8 - local_9f0) * lVar106;
                                lVar55 = CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2]) * 8;
                                lVar51 = ((long)local_ea0 - (long)local_9f4) * lVar55;
                                lVar96 = lVar51 + lVar65;
                                lVar98 = lVar77 * 0x38;
                                lVar106 = (local_f08 - local_9f0) * lVar106;
                                lVar51 = lVar51 + lVar106;
                                lVar55 = (local_ef8 - local_9f4) * lVar55;
                                lVar65 = lVar65 + lVar55;
                                lVar55 = lVar55 + lVar106;
                                lVar108 = lVar77 * 0x10;
                                lVar40 = (long)local_9f8;
                                lVar104 = lVar77 * 0x90;
                                lVar109 = lVar77 * 0x40;
                                lVar58 = lVar77 * 0x30;
                                lVar103 = bx_6.smallend.vect._0_8_ + lVar63;
                                lVar106 = lVar96 + lVar104 + lVar40 * -8 + lVar103;
                                lVar107 = lVar96 + lVar109 + lVar40 * -8 + lVar103;
                                lVar101 = lVar96 + lVar98 + lVar40 * -8 + lVar103;
                                lVar79 = lVar96 + lVar58 + lVar40 * -8 + lVar103;
                                lVar100 = lVar96 + lVar108 + lVar40 * -8 + lVar103;
                                lVar64 = lVar96 + lVar77 * 8 + lVar40 * -8 + lVar103;
                                lVar96 = lVar96 + lVar40 * -8 + lVar103;
                                lVar59 = lVar51 + lVar104 + lVar40 * -8 + lVar103;
                                lVar41 = lVar51 + lVar109 + lVar40 * -8 + lVar103;
                                lVar42 = lVar51 + lVar98 + lVar40 * -8 + lVar103;
                                lVar43 = lVar51 + lVar58 + lVar40 * -8 + lVar103;
                                lVar44 = lVar51 + lVar108 + lVar40 * -8 + lVar103;
                                lVar45 = lVar51 + lVar77 * 8 + lVar40 * -8 + lVar103;
                                lVar51 = lVar51 + lVar40 * -8 + lVar103;
                                lVar102 = lVar65 + lVar104 + lVar40 * -8 + lVar103;
                                lVar99 = lVar65 + lVar109 + lVar40 * -8 + lVar103;
                                lVar86 = lVar65 + lVar98 + lVar40 * -8 + lVar103;
                                lVar85 = lVar65 + lVar58 + lVar40 * -8 + lVar103;
                                lVar76 = lVar65 + lVar108 + lVar40 * -8 + lVar103;
                                lVar39 = lVar65 + lVar77 * 8 + lVar40 * -8 + lVar103;
                                lVar65 = lVar65 + lVar40 * -8 + lVar103;
                                lVar90 = lVar104 + lVar55 + lVar40 * -8 + lVar103;
                                lVar110 = lVar109 + lVar55 + lVar40 * -8 + lVar103;
                                lVar109 = lVar98 + lVar55 + lVar40 * -8 + lVar103;
                                lVar98 = lVar58 + lVar55 + lVar40 * -8 + lVar103;
                                lVar58 = lVar108 + lVar55 + lVar40 * -8 + lVar103;
                                lVar104 = lVar55 + lVar77 * 8 + lVar40 * -8 + lVar103;
                                lVar103 = lVar55 + lVar40 * -8 + lVar103;
                                lVar77 = 0;
                                do {
                                  dVar119 = 0.0;
                                  if (*(int *)(local_ff0 + lVar77 * 4) == 0) {
                                    uVar134 = (ulong)DAT_0065b980;
                                    dVar119 = ((*(double *)(lVar85 + -8 + lVar77 * 8) +
                                                *(double *)(lVar86 + -8 + lVar77 * 8) +
                                               *(double *)(lVar99 + -8 + lVar77 * 8)) * 0.5 +
                                               *(double *)
                                                ((long)local_9b0.p + lVar77 * 8 + lVar97 + -8) *
                                               0.125 + (*(double *)(lVar65 + -8 + lVar77 * 8) +
                                                        *(double *)(lVar39 + -8 + lVar77 * 8) +
                                                       *(double *)(lVar76 + -8 + lVar77 * 8)) * 0.25
                                              + *(double *)(lVar102 + -8 + lVar77 * 8)) *
                                              *(double *)((long)local_fe8 + -8 + lVar77 * 8) +
                                              (((((double)(*(ulong *)(lVar85 + lVar77 * 8) ^ uVar134
                                                          ) - *(double *)(lVar86 + lVar77 * 8)) +
                                                *(double *)(lVar99 + lVar77 * 8)) * 0.5 +
                                               *(double *)((long)local_9b0.p + lVar77 * 8 + lVar97)
                                               * 0.125 + ((*(double *)(lVar39 + lVar77 * 8) -
                                                          *(double *)(lVar65 + lVar77 * 8)) +
                                                         *(double *)(lVar76 + lVar77 * 8)) * 0.25) -
                                              *(double *)(lVar102 + lVar77 * 8)) *
                                              *(double *)((long)local_fe8 + lVar77 * 8) +
                                              ((((*(double *)(lVar101 + -8 + lVar77 * 8) -
                                                 *(double *)(lVar79 + -8 + lVar77 * 8)) -
                                                *(double *)(lVar107 + -8 + lVar77 * 8)) * 0.5 +
                                               *(double *)
                                                ((long)local_9b0.p + lVar77 * 8 + lVar92 + -8) *
                                               0.125 + ((*(double *)(lVar96 + -8 + lVar77 * 8) -
                                                        *(double *)(lVar64 + -8 + lVar77 * 8)) +
                                                       *(double *)(lVar100 + -8 + lVar77 * 8)) *
                                                       0.25) -
                                              *(double *)(lVar106 + -8 + lVar77 * 8)) *
                                              *(double *)(local_fc0 + -8 + lVar77 * 8) +
                                              (((*(double *)(lVar79 + lVar77 * 8) -
                                                *(double *)(lVar101 + lVar77 * 8)) -
                                               *(double *)(lVar107 + lVar77 * 8)) * 0.5 +
                                               *(double *)((long)local_9b0.p + lVar77 * 8 + lVar92)
                                               * 0.125 + (((double)(*(ulong *)(lVar96 + lVar77 * 8)
                                                                   ^ uVar134) -
                                                          *(double *)(lVar64 + lVar77 * 8)) +
                                                         *(double *)(lVar100 + lVar77 * 8)) * 0.25 +
                                              *(double *)(lVar106 + lVar77 * 8)) *
                                              *(double *)(local_fc0 + lVar77 * 8) +
                                              ((((*(double *)(lVar98 + -8 + lVar77 * 8) -
                                                 *(double *)(lVar109 + -8 + lVar77 * 8)) -
                                                *(double *)(lVar110 + -8 + lVar77 * 8)) * 0.5 +
                                               *(double *)
                                                ((long)local_9b0.p + lVar77 * 8 + lVar46 + -8) *
                                               0.125 + ((*(double *)(lVar103 + -8 + lVar77 * 8) +
                                                        *(double *)(lVar104 + -8 + lVar77 * 8)) -
                                                       *(double *)(lVar58 + -8 + lVar77 * 8)) * 0.25
                                               ) - *(double *)(lVar90 + -8 + lVar77 * 8)) *
                                              *(double *)((long)local_fb8 + -8 + lVar77 * 8) +
                                              (((*(double *)(lVar109 + lVar77 * 8) -
                                                *(double *)(lVar98 + lVar77 * 8)) -
                                               *(double *)(lVar110 + lVar77 * 8)) * 0.5 +
                                               *(double *)((long)local_9b0.p + lVar77 * 8 + lVar46)
                                               * 0.125 + ((*(double *)(lVar104 + lVar77 * 8) -
                                                          *(double *)(lVar103 + lVar77 * 8)) -
                                                         *(double *)(lVar58 + lVar77 * 8)) * 0.25 +
                                              *(double *)(lVar90 + lVar77 * 8)) *
                                              *(double *)((long)local_fb8 + lVar77 * 8) +
                                              (((*(double *)(lVar43 + lVar77 * 8) +
                                                 *(double *)(lVar42 + lVar77 * 8) +
                                                *(double *)(lVar41 + lVar77 * 8)) * 0.5 +
                                               *(double *)((long)local_9b0.p + lVar77 * 8 + lVar89)
                                               * 0.125 + (((double)(*(ulong *)(lVar51 + lVar77 * 8)
                                                                   ^ uVar134) -
                                                          *(double *)(lVar45 + lVar77 * 8)) -
                                                         *(double *)(lVar44 + lVar77 * 8)) * 0.25) -
                                              *(double *)(lVar59 + lVar77 * 8)) *
                                              *(double *)((long)local_fa0 + lVar77 * 8) +
                                              ((((double)(*(ulong *)(lVar43 + -8 + lVar77 * 8) ^
                                                         uVar134) -
                                                *(double *)(lVar42 + -8 + lVar77 * 8)) +
                                               *(double *)(lVar41 + -8 + lVar77 * 8)) * 0.5 +
                                               *(double *)
                                                ((long)local_9b0.p + lVar77 * 8 + lVar89 + -8) *
                                               0.125 + ((*(double *)(lVar51 + -8 + lVar77 * 8) -
                                                        *(double *)(lVar45 + -8 + lVar77 * 8)) -
                                                       *(double *)(lVar44 + -8 + lVar77 * 8)) * 0.25
                                              + *(double *)(lVar59 + -8 + lVar77 * 8)) *
                                              *(double *)((long)local_fa0 + -8 + lVar77 * 8);
                                  }
                                  *(double *)(lVar95 + lVar77 * 8) =
                                       dVar119 + *(double *)(lVar95 + lVar77 * 8);
                                  lVar77 = lVar77 + 1;
                                } while ((local_db8.bigend.vect[0] - local_db8.smallend.vect[0]) + 1
                                         != (int)lVar77);
                              }
                              local_ea0 = (double *)((long)local_ea0 + 1);
                              lVar95 = lVar95 + lVar70 * 8;
                              local_ff0 = local_ff0 + local_af8.jstride * 4;
                              local_fc0 = local_fc0 + lVar93;
                              local_fa0 = (double *)((long)local_fa0 + lVar93);
                              local_fe8 = (double *)((long)local_fe8 + lVar93);
                              local_fb8 = (double *)((long)local_fb8 + lVar93);
                              local_ef8 = local_ef8 + 1;
                            } while (local_db8.bigend.vect[1] + 1 != (int)local_ea0);
                          }
                          local_f08 = local_f08 + 1;
                          local_e48 = local_e48 + lVar73 * lVar70 * 8;
                          local_e50 = local_e50 + lVar35;
                          local_e58 = local_e58 + lVar35;
                          local_ed8 = local_ed8 + lVar35;
                          local_e18 = local_e18 + lVar35;
                          local_ea8 = local_ea8 + 1;
                        } while (local_db8.bigend.vect[2] + 1 != (int)local_f08);
                      }
                    }
                    else {
                      local_fb0 = (long)local_db8.smallend.vect[2];
                      if (local_db8.smallend.vect[2] <= local_db8.bigend.vect[2]) {
                        lVar81 = (long)local_db8.smallend.vect[1];
                        lVar56 = (long)local_db8.smallend.vect[0];
                        lVar35 = lVar81 * 8;
                        local_f88 = (lVar35 + (local_fb0 - lVar61) * lVar73 * 8 + lVar74 * -8) *
                                    lVar70 + lVar56 * 8 + lVar75 * -8 + (long)pdVar32;
                        pdVar54 = pdVar33 + (lVar56 - lVar49);
                        lVar63 = lVar84 * 8 * lVar50;
                        lVar93 = (local_fb0 - lVar36) * lVar84;
                        iVar48 = ~iVar28 + local_db8.smallend.vect[2];
                        local_f40 = (lVar35 + lVar93 * 8 + lVar80 * -8) * lVar50 + lVar56 * 8 +
                                    lVar49 * -8 + (long)pdVar33;
                        local_fd8 = pdVar54;
                        do {
                          if (local_db8.smallend.vect[1] <= local_db8.bigend.vect[1]) {
                            lVar107 = (long)iVar48 * lVar84 * 8;
                            pdVar78 = (double *)
                                      ((lVar35 + lVar80 * -8 + lVar107) * lVar50 + (long)pdVar54);
                            lVar79 = (~iVar28 + (int)local_fb0) * lVar62;
                            lVar101 = (local_fb0 - lVar36) * lVar62;
                            lVar100 = (long)local_af8.p +
                                      (lVar81 - local_af8.begin.y) * local_af8.jstride * 4 +
                                      (local_fb0 - local_af8.begin.z) * local_af8.kstride * 4 +
                                      (long)local_af8.begin.x * -4 + lVar56 * 4;
                            lVar95 = lVar81;
                            lVar96 = local_f88;
                            lVar106 = local_f40;
                            iVar66 = ~iVar105 + local_db8.smallend.vect[1];
                            do {
                              if (local_db8.smallend.vect[0] <= local_db8.bigend.vect[0]) {
                                lVar59 = (~iVar105 + (int)lVar95) * lVar50;
                                lVar41 = (lVar95 - lVar80) * lVar50;
                                lVar42 = 0;
                                do {
                                  dVar119 = 0.0;
                                  if (*(int *)(lVar100 + lVar42 * 4) == 0) {
                                    lVar43 = (long)(~iVar69 + local_db8.smallend.vect[0] +
                                                   (int)lVar42);
                                    dVar119 = (pdVar33[lVar59 + lVar43 + lVar79] +
                                               *(double *)
                                                ((long)pdVar54 +
                                                lVar42 * 8 + (lVar107 + (long)iVar66 * 8) * lVar50)
                                               + pdVar33[lVar41 + lVar43 + lVar79] + pdVar78[lVar42]
                                               + pdVar33[lVar59 + lVar43 + lVar101] +
                                               *(double *)
                                                ((long)local_fd8 +
                                                lVar42 * 8 +
                                                (lVar93 * 8 + (long)iVar66 * 8) * lVar50) +
                                               pdVar33[lVar41 + lVar43 + lVar101] +
                                              *(double *)(lVar106 + lVar42 * 8)) * 0.125;
                                  }
                                  *(double *)(lVar96 + lVar42 * 8) =
                                       dVar119 + *(double *)(lVar96 + lVar42 * 8);
                                  lVar42 = lVar42 + 1;
                                } while ((local_db8.bigend.vect[0] - local_db8.smallend.vect[0]) + 1
                                         != (int)lVar42);
                              }
                              lVar95 = lVar95 + 1;
                              lVar96 = lVar96 + lVar70 * 8;
                              lVar100 = lVar100 + local_af8.jstride * 4;
                              iVar66 = iVar66 + 1;
                              lVar106 = lVar106 + lVar50 * 8;
                              pdVar78 = pdVar78 + lVar50;
                            } while (local_db8.bigend.vect[1] + 1 != (int)lVar95);
                          }
                          local_fb0 = local_fb0 + 1;
                          local_f88 = local_f88 + lVar73 * lVar70 * 8;
                          local_fd8 = (double *)((long)local_fd8 + lVar63);
                          iVar48 = iVar48 + 1;
                          local_f40 = local_f40 + lVar63;
                        } while (local_db8.bigend.vect[2] + 1 != (int)local_fb0);
                      }
                    }
                  }
                  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                            ((Array4<double> *)&local_a78,
                             &sync_resid->super_FabArray<amrex::FArrayBox>,&mfi_1);
                  FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                            (&local_9b0,&phi.super_FabArray<amrex::FArrayBox>,&mfi_1);
                  if (FVar34 == singlevalued) {
                    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                              ((Array4<const_double> *)&bx_6,(FabArray<amrex::FArrayBox> *)*puVar27,
                               &mfi_1);
                    local_a38.bigend.vect[2] = local_db8.bigend.vect[2];
                    local_a38.bigend.vect[0] = local_db8.bigend.vect[0];
                    local_a38.bigend.vect[1] = local_db8.bigend.vect[1];
                    local_a38.smallend.vect[0] = local_db8.smallend.vect[0] + -1;
                    local_a38.smallend.vect[1] = local_db8.smallend.vect[1] + -1;
                    local_a38.smallend.vect[2] = local_db8.smallend.vect[2] + -1;
                    bx_4.bigend.vect[1] = local_db8.bigend.vect[1];
                    bx_4.bigend.vect[2] = local_db8.bigend.vect[2];
                    bx_4.smallend.vect[0] = local_a38.smallend.vect[0];
                    bx_4.smallend.vect[1] = local_a38.smallend.vect[1];
                    bx_4.smallend.vect[2] = local_a38.smallend.vect[2];
                    bx_4.bigend.vect[0] = local_db8.bigend.vect[0];
                    lVar84 = 0;
                    do {
                      if ((local_db8.btype.itype >> ((uint)lVar84 & 0x1f) & 1) != 0) {
                        piVar37 = bx_4.bigend.vect + lVar84;
                        *piVar37 = *piVar37 + -1;
                      }
                      lVar84 = lVar84 + 1;
                    } while (lVar84 != 3);
                    bx_4.btype.itype = 0;
                    result.btype.itype = 0;
                    result.smallend.vect[2] = local_db8.smallend.vect[2] + -2;
                    result.bigend.vect[0] = bx_4.bigend.vect[0] + 1;
                    result.smallend.vect[1] = local_db8.smallend.vect[1] + -2;
                    result.smallend.vect[0] = local_db8.smallend.vect[0] + -2;
                    result.bigend.vect[1] = bx_4.bigend.vect[1] + 1;
                    result.bigend.vect[2] = bx_4.bigend.vect[2] + 1;
                    FArrayBox::resize(&sten,&local_a38,9,(Arena *)0x0);
                    DVar38 = sten.super_BaseFab<double>.super_DataAllocator;
                    if (sten.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
                      DVar38.m_arena = The_Arena();
                    }
                    Gpu::Elixir::Elixir(&steneli,(void *)0x0,DVar38.m_arena);
                    iVar67 = sten.super_BaseFab<double>.domain.bigend.vect[2];
                    iVar66 = sten.super_BaseFab<double>.domain.bigend.vect[1];
                    iVar48 = sten.super_BaseFab<double>.domain.bigend.vect[0];
                    iVar28 = sten.super_BaseFab<double>.domain.smallend.vect[2];
                    iVar105 = sten.super_BaseFab<double>.domain.smallend.vect[1];
                    iVar69 = sten.super_BaseFab<double>.domain.smallend.vect[0];
                    pdVar33 = sten.super_BaseFab<double>.dptr;
                    lVar35 = (long)sten.super_BaseFab<double>.domain.smallend.vect[0];
                    uVar134 = (ulong)sten.super_BaseFab<double>.domain.smallend.vect[1];
                    lVar84 = (long)sten.super_BaseFab<double>.domain.smallend.vect[2];
                    FArrayBox::resize(&cn,&result,0x1c,(Arena *)0x0);
                    arena = (Arena *)CONCAT44(cn.super_BaseFab<double>.super_DataAllocator.m_arena.
                                              _4_4_,(int)cn.super_BaseFab<double>.
                                                         super_DataAllocator.m_arena);
                    if (arena == (Arena *)0x0) {
                      arena = The_Arena();
                    }
                    lVar62 = (long)((iVar48 - iVar69) + 1);
                    lVar63 = (long)((iVar66 - iVar105) + 1);
                    lVar93 = (long)((iVar67 - iVar28) + 1);
                    Gpu::Elixir::Elixir(&cneli,(void *)0x0,arena);
                    iVar28 = cn.super_BaseFab<double>.domain.smallend.vect[2];
                    iVar105 = cn.super_BaseFab<double>.domain.smallend.vect[1];
                    iVar69 = cn.super_BaseFab<double>.domain.smallend.vect[0];
                    lVar80 = CONCAT44(cn.super_BaseFab<double>.dptr._4_4_,
                                      (int)cn.super_BaseFab<double>.dptr);
                    lVar107 = (long)cn.super_BaseFab<double>.domain.smallend.vect[0];
                    lVar81 = (long)cn.super_BaseFab<double>.domain.smallend.vect[1];
                    lVar56 = (long)cn.super_BaseFab<double>.domain.smallend.vect[2];
                    lVar95 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[0] -
                                    cn.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
                    lVar36 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[1] -
                                    cn.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
                    lVar96 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[2] -
                                    cn.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
                    lVar49 = lVar36 * lVar95;
                    lVar106 = lVar96 * lVar49;
                    local_d80 = lVar106 * 0xd8;
                    FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                              ((Array4<const_amrex::EBCellFlag> *)&bx_4,local_9d0,&mfi_1);
                    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                              (&local_490,local_b30,&mfi_1);
                    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                              (&local_518,
                               (FabArray<amrex::FArrayBox> *)
                               local_b28._M_t.
                               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi_1)
                    ;
                    BATransformer::operator()
                              (&local_44c,
                               (BATransformer *)
                               (CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) + 8),
                               (Box *)((long)((mfi_1.index_map)->
                                             super_vector<int,_std::allocator<int>_>).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[mfi_1.currentIndex] *
                                       0x1c + **(long **)(CONCAT44(mfi_1.fabArray._4_4_,
                                                                   (int)mfi_1.fabArray) + 0x50)));
                    auVar31 = _DAT_0067f170;
                    auVar30 = _DAT_0065b9b0;
                    auVar29 = _DAT_0065b9a0;
                    bx_5.bigend.vect[1] = local_44c.bigend.vect[1];
                    bx_5.bigend.vect[2] = local_44c.bigend.vect[2];
                    bx_5.btype.itype = local_44c.btype.itype;
                    bx_5.smallend.vect[0] = local_44c.smallend.vect[0];
                    bx_5.smallend.vect[1] = local_44c.smallend.vect[1];
                    uVar120 = bx_5.smallend.vect._0_8_;
                    bx_5.bigend.vect[0] = local_44c.bigend.vect[0];
                    lVar50 = 0;
                    do {
                      if ((bx_5.btype.itype >> ((uint)lVar50 & 0x1f) & 1) != 0) {
                        piVar37 = bx_5.bigend.vect + lVar50;
                        *piVar37 = *piVar37 + -1;
                      }
                      lVar50 = lVar50 + 1;
                    } while (lVar50 != 3);
                    local_d80 = local_d80 + lVar80;
                    local_f38 = (long)result.smallend.vect[2];
                    if (result.smallend.vect[2] <= result.bigend.vect[2]) {
                      lVar101 = (long)result.smallend.vect[0];
                      lVar50 = (long)result.smallend.vect[1];
                      iVar48 = bx_5.bigend.vect[2];
                      if (result.bigend.vect[2] < bx_5.bigend.vect[2]) {
                        iVar48 = result.bigend.vect[2];
                      }
                      iVar66 = bx_5.bigend.vect[1];
                      if (result.bigend.vect[1] < bx_5.bigend.vect[1]) {
                        iVar66 = result.bigend.vect[1];
                      }
                      if (result.bigend.vect[0] < bx_5.bigend.vect[0]) {
                        bx_5.bigend.vect[0] = result.bigend.vect[0];
                      }
                      iVar67 = local_44c.smallend.vect[2];
                      if (local_44c.smallend.vect[2] < result.smallend.vect[2]) {
                        iVar67 = result.smallend.vect[2];
                      }
                      bx_5.smallend.vect[1] = local_44c.smallend.vect[1];
                      if (bx_5.smallend.vect[1] < result.smallend.vect[1]) {
                        bx_5.smallend.vect[1] = result.smallend.vect[1];
                      }
                      bx_5.smallend.vect[0] = local_44c.smallend.vect[0];
                      if (bx_5.smallend.vect[0] < result.smallend.vect[0]) {
                        bx_5.smallend.vect[0] = result.smallend.vect[0];
                      }
                      lVar79 = lVar106 * 0x10;
                      local_d18 = ((lVar96 * 8 + local_f38 * 8 + lVar56 * -8) * lVar36 + lVar50 * 8
                                  + lVar81 * -8) * lVar95 + lVar101 * 8 + lVar107 * -8 + lVar80;
                      local_c88 = (lVar50 * 8 + (local_f38 - lVar56) * lVar36 * 8 + lVar81 * -8) *
                                  lVar95 + lVar101 * 8 + lVar107 * -8 + lVar80;
                      local_d78 = lVar106 * 0x78;
                      local_d88 = lVar106 * 200;
                      do {
                        if (result.smallend.vect[1] <= result.bigend.vect[1]) {
                          lVar100 = (local_f38 - lVar56) * lVar49;
                          local_ea0 = (double *)local_c88;
                          local_ef8 = local_d18;
                          local_ff0 = lVar50;
                          do {
                            if (result.smallend.vect[0] <= result.bigend.vect[0]) {
                              lVar43 = (local_ff0 - lVar81) * lVar95;
                              lVar44 = (local_ff0 - local_490.begin.y) * local_490.jstride;
                              lVar51 = (local_f38 - local_490.begin.z) * local_490.kstride;
                              lVar59 = lVar80 + lVar100 * 8 + lVar43 * 8;
                              lVar45 = (local_ff0 - local_518.begin.y) * local_518.jstride;
                              lVar65 = (local_f38 - local_518.begin.z) * local_518.kstride;
                              pdVar54 = local_ea0;
                              lVar41 = local_ef8;
                              lVar42 = lVar101;
                              do {
                                iVar141 = auVar31._0_4_;
                                iVar144 = auVar31._4_4_;
                                if (((((lVar42 < bx_5.smallend.vect[0]) ||
                                      (local_ff0 < bx_5.smallend.vect[1])) || (local_f38 < iVar67))
                                    || ((bx_5.bigend.vect[0] < lVar42 || (iVar66 < local_ff0)))) ||
                                   ((iVar48 < local_f38 ||
                                    (*(int *)((local_ff0 - (int)local_bc4) *
                                              CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) *
                                              4 + bx_1.smallend.vect._0_8_ +
                                              (local_f38 - (int)local_bc0) *
                                              CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4
                                             + (lVar42 - local_bc8) * 4) == 0)))) {
                                  lVar104 = lVar42 - lVar107;
                                  lVar58 = 0x1c;
                                  lVar77 = 0;
                                  auVar132 = auVar29;
                                  do {
                                    if (SUB164(auVar132 ^ auVar30,4) == iVar144 &&
                                        SUB164(auVar132 ^ auVar30,0) < iVar141) {
                                      *(undefined8 *)((long)pdVar54 + lVar77) = 0;
                                      *(undefined8 *)(lVar41 + lVar77) = 0;
                                    }
                                    lVar92 = auVar132._8_8_;
                                    auVar132._0_8_ = auVar132._0_8_ + 2;
                                    auVar132._8_8_ = lVar92 + 2;
                                    lVar77 = lVar77 + lVar79;
                                    lVar58 = lVar58 + -2;
                                  } while (lVar58 != 0);
                                  uVar121 = 0;
                                }
                                else {
                                  uVar68 = *(uint *)((local_ff0 - local_874) *
                                                     CONCAT44(bx_4.bigend.vect[0],
                                                              bx_4.smallend.vect[2]) * 4 +
                                                     bx_4.smallend.vect._0_8_ +
                                                     (local_f38 - local_870) *
                                                     CONCAT44(bx_4.bigend.vect[2],
                                                              bx_4.bigend.vect[1]) * 4 +
                                                    (lVar42 - local_878) * 4) & 3;
                                  if (uVar68 == 0) {
LAB_00581454:
                                    lVar104 = lVar42 - lVar107;
                                    lVar58 = 0x1c;
                                    lVar77 = 0;
                                    auVar133 = auVar29;
                                    do {
                                      if (SUB164(auVar133 ^ auVar30,4) == iVar144 &&
                                          SUB164(auVar133 ^ auVar30,0) < iVar141) {
                                        *(undefined8 *)((long)pdVar54 + lVar77) = 0x3ff0000000000000
                                        ;
                                        *(undefined8 *)(lVar41 + lVar77) = 0x3ff0000000000000;
                                      }
                                      lVar92 = auVar133._8_8_;
                                      auVar133._0_8_ = auVar133._0_8_ + 2;
                                      auVar133._8_8_ = lVar92 + 2;
                                      lVar77 = lVar77 + lVar79;
                                      lVar58 = lVar58 + -2;
                                    } while (lVar58 != 0);
                                  }
                                  else if (uVar68 == 3) {
                                    lVar104 = lVar42 - lVar107;
                                    lVar58 = 0x1c;
                                    lVar77 = 0;
                                    auVar131 = auVar29;
                                    do {
                                      if (SUB164(auVar131 ^ auVar30,4) == iVar144 &&
                                          SUB164(auVar131 ^ auVar30,0) < iVar141) {
                                        *(undefined8 *)((long)pdVar54 + lVar77) = 0;
                                        *(undefined8 *)(lVar41 + lVar77) = 0;
                                      }
                                      lVar92 = auVar131._8_8_;
                                      auVar131._0_8_ = auVar131._0_8_ + 2;
                                      auVar131._8_8_ = lVar92 + 2;
                                      lVar77 = lVar77 + lVar79;
                                      lVar58 = lVar58 + -2;
                                    } while (lVar58 != 0);
                                  }
                                  else {
                                    lVar58 = lVar42 - local_490.begin.x;
                                    if (0.9999999999999778 <= local_490.p[lVar44 + lVar51 + lVar58])
                                    goto LAB_00581454;
                                    lVar92 = lVar42 - local_518.begin.x;
                                    uVar138 = (ulong)DAT_0065b980;
                                    lVar104 = lVar42 - lVar107;
                                    *(double *)(lVar59 + lVar104 * 8) =
                                         (((local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 6] -
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 9]) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xb]) +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf]) * 9.0
                                         + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                           (((double)((ulong)local_518.p[lVar45 + lVar65 + lVar92] ^
                                                     uVar138) -
                                            local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride]) +
                                            local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 3] +
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]) *
                                           2.25;
                                    lVar77 = lVar59 + lVar104 * 8;
                                    *(double *)(lVar77 + lVar106 * 8) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xb] -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 3]
                                                 - local_518.p[lVar45 + lVar65 + lVar92]) -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 4])
                                                * 4.5;
                                    *(double *)(lVar79 + lVar77) =
                                         (((local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 9] -
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 6]) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xb]) +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf]) * 9.0
                                         + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                           ((local_518.p
                                             [lVar45 + lVar65 + lVar92 + local_518.nstride] -
                                            local_518.p[lVar45 + lVar65 + lVar92]) +
                                            local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 3] +
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]) *
                                           2.25;
                                    *(double *)(lVar106 * 0x18 + lVar77) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 9] -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                (((double)((ulong)local_518.p
                                                                  [lVar45 + lVar65 + lVar92 + 
                                                  local_518.nstride] ^ uVar138) -
                                                 local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 3])
                                                + local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]
                                                ) * 4.5;
                                    *(double *)(lVar106 * 0x20 + lVar77) =
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf] * 36.0
                                         + local_490.p[lVar44 + lVar51 + lVar58] * 2.25 +
                                           ((double)((ulong)local_518.p
                                                            [lVar45 + lVar65 + lVar92 + local_518.
                                                                                        nstride * 3]
                                                    ^ uVar138) -
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]) * 9.0
                                    ;
                                    *(double *)(lVar106 * 0x28 + lVar77) =
                                         ((double)((ulong)local_518.p
                                                          [lVar45 + lVar65 + lVar92 + local_518.
                                                                                      nstride * 9] ^
                                                  uVar138) -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride] -
                                                 local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 3])
                                                + local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]
                                                ) * 4.5;
                                    *(double *)(lVar106 * 0x30 + lVar77) =
                                         (((double)((ulong)local_518.p
                                                           [lVar45 + lVar65 + lVar92 + local_518.
                                                                                       nstride * 6]
                                                   ^ uVar138) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 9]) +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xb] +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf]) * 9.0
                                         + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                           ((local_518.p[lVar45 + lVar65 + lVar92] -
                                            local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride]) +
                                            local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 3] +
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]) *
                                           2.25;
                                    *(double *)(lVar106 * 0x38 + lVar77) =
                                         ((double)((ulong)local_518.p
                                                          [lVar45 + lVar65 + lVar92 + local_518.
                                                                                      nstride * 0xb]
                                                  ^ uVar138) -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p[lVar45 + lVar65 + lVar92] +
                                                 local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 3])
                                                - local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]
                                                ) * 4.5;
                                    *(double *)(lVar106 * 0x40 + lVar77) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 6] +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 9] +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xb] +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xf]) * 9.0
                                         + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                           (local_518.p[lVar45 + lVar65 + lVar92] +
                                            local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride] +
                                            local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 3] +
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]) *
                                           2.25;
                                    *(double *)(lVar106 * 0x48 + lVar77) =
                                         (((local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 7] -
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 10]) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xd]) +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10]) *
                                         9.0 + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                               (((double)((ulong)local_518.p
                                                                 [lVar45 + lVar65 + lVar92] ^
                                                         uVar138) -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 2])
                                                + local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 3]
                                               + local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 5])
                                               * 2.25;
                                    *(double *)(lVar106 * 0x50 + lVar77) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xd] -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 3]
                                                 - local_518.p[lVar45 + lVar65 + lVar92]) -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 5])
                                                * 4.5;
                                    *(double *)(lVar106 * 0x58 + lVar77) =
                                         (((local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 10] -
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 7]) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xd]) +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10]) *
                                         9.0 + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                               ((local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 2]
                                                - local_518.p[lVar45 + lVar65 + lVar92]) +
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 3] +
                                               local_518.p
                                               [lVar45 + lVar65 + lVar92 + local_518.nstride * 5]) *
                                               2.25;
                                    *(double *)(lVar106 * 0x60 + lVar77) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 10] -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                (((double)((ulong)local_518.p
                                                                  [lVar45 + lVar65 + lVar92 + 
                                                  local_518.nstride * 2] ^ uVar138) -
                                                 local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 3])
                                                + local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 5]
                                                ) * 4.5;
                                    *(double *)(lVar106 * 0x68 + lVar77) =
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10] *
                                         36.0 + local_490.p[lVar44 + lVar51 + lVar58] * 2.25 +
                                                ((double)((ulong)local_518.p
                                                                 [lVar45 + lVar65 + lVar92 + 
                                                  local_518.nstride * 3] ^ uVar138) -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 5])
                                                * 9.0;
                                    *(double *)(lVar106 * 0x70 + lVar77) =
                                         ((double)((ulong)local_518.p
                                                          [lVar45 + lVar65 + lVar92 + local_518.
                                                                                      nstride * 10]
                                                  ^ uVar138) -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 2]
                                                 - local_518.p
                                                   [lVar45 + lVar65 + lVar92 + local_518.nstride * 3
                                                   ]) + local_518.p
                                                        [lVar45 + lVar65 + lVar92 + local_518.
                                                                                    nstride * 5]) *
                                                4.5;
                                    *(double *)(local_d78 + lVar77) =
                                         (((double)((ulong)local_518.p
                                                           [lVar45 + lVar65 + lVar92 + local_518.
                                                                                       nstride * 7]
                                                   ^ uVar138) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 10]) +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xd] +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10]) *
                                         9.0 + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                               ((local_518.p[lVar45 + lVar65 + lVar92] -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 2])
                                                + local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 3]
                                               + local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 5])
                                               * 2.25;
                                    *(double *)(lVar106 * 0x80 + lVar77) =
                                         ((double)((ulong)local_518.p
                                                          [lVar45 + lVar65 + lVar92 + local_518.
                                                                                      nstride * 0xd]
                                                  ^ uVar138) -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p[lVar45 + lVar65 + lVar92] +
                                                 local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 3])
                                                - local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 5]
                                                ) * 4.5;
                                    *(double *)(lVar106 * 0x88 + lVar77) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 7] +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 10] +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xd] +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x10]) *
                                         9.0 + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                               (local_518.p[lVar45 + lVar65 + lVar92] +
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 2] +
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 3] +
                                               local_518.p
                                               [lVar45 + lVar65 + lVar92 + local_518.nstride * 5]) *
                                               2.25;
                                    *(double *)(lVar106 * 0x90 + lVar77) =
                                         (((local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 8] -
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xc]) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xe]) +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11]) *
                                         9.0 + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                               (((double)((ulong)local_518.p
                                                                 [lVar45 + lVar65 + lVar92 + 
                                                  local_518.nstride] ^ uVar138) -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 2])
                                                + local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]
                                               + local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 5])
                                               * 2.25;
                                    *(double *)(lVar106 * 0x98 + lVar77) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xe] -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]
                                                 - local_518.p
                                                   [lVar45 + lVar65 + lVar92 + local_518.nstride]) -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 5])
                                                * 4.5;
                                    *(double *)(lVar106 * 0xa0 + lVar77) =
                                         (((local_518.p
                                            [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xc] -
                                           local_518.p
                                           [lVar45 + lVar65 + lVar92 + local_518.nstride * 8]) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xe]) +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11]) *
                                         9.0 + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                               ((local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 2]
                                                - local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride]) +
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 4] +
                                               local_518.p
                                               [lVar45 + lVar65 + lVar92 + local_518.nstride * 5]) *
                                               2.25;
                                    *(double *)(lVar106 * 0xa8 + lVar77) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xc] -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                (((double)((ulong)local_518.p
                                                                  [lVar45 + lVar65 + lVar92 + 
                                                  local_518.nstride * 2] ^ uVar138) -
                                                 local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 4])
                                                + local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 5]
                                                ) * 4.5;
                                    *(double *)(lVar106 * 0xb0 + lVar77) =
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11] *
                                         36.0 + local_490.p[lVar44 + lVar51 + lVar58] * 2.25 +
                                                ((double)((ulong)local_518.p
                                                                 [lVar45 + lVar65 + lVar92 + 
                                                  local_518.nstride * 4] ^ uVar138) -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 5])
                                                * 9.0;
                                    *(double *)(lVar106 * 0xb8 + lVar77) =
                                         ((double)((ulong)local_518.p
                                                          [lVar45 + lVar65 + lVar92 + local_518.
                                                                                      nstride * 0xc]
                                                  ^ uVar138) -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 2]
                                                 - local_518.p
                                                   [lVar45 + lVar65 + lVar92 + local_518.nstride * 4
                                                   ]) + local_518.p
                                                        [lVar45 + lVar65 + lVar92 + local_518.
                                                                                    nstride * 5]) *
                                                4.5;
                                    *(double *)(lVar106 * 0xc0 + lVar77) =
                                         (((double)((ulong)local_518.p
                                                           [lVar45 + lVar65 + lVar92 + local_518.
                                                                                       nstride * 8]
                                                   ^ uVar138) -
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xc]) +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xe] +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11]) *
                                         9.0 + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                               ((local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride] -
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 2])
                                                + local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 4]
                                               + local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 5])
                                               * 2.25;
                                    *(double *)(local_d88 + lVar77) =
                                         ((double)((ulong)local_518.p
                                                          [lVar45 + lVar65 + lVar92 + local_518.
                                                                                      nstride * 0xe]
                                                  ^ uVar138) -
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11]) *
                                         18.0 + local_490.p[lVar44 + lVar51 + lVar58] * 1.125 +
                                                ((local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride] +
                                                 local_518.p
                                                 [lVar45 + lVar65 + lVar92 + local_518.nstride * 4])
                                                - local_518.p
                                                  [lVar45 + lVar65 + lVar92 + local_518.nstride * 5]
                                                ) * 4.5;
                                    *(double *)(lVar106 * 0xd0 + lVar77) =
                                         (local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 8] +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xc] +
                                          local_518.p
                                          [lVar45 + lVar65 + lVar92 + local_518.nstride * 0xe] +
                                         local_518.p
                                         [lVar45 + lVar65 + lVar92 + local_518.nstride * 0x11]) *
                                         9.0 + local_490.p[lVar44 + lVar51 + lVar58] * 0.5625 +
                                               (local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride] +
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 2] +
                                                local_518.p
                                                [lVar45 + lVar65 + lVar92 + local_518.nstride * 4] +
                                               local_518.p
                                               [lVar45 + lVar65 + lVar92 + local_518.nstride * 5]) *
                                               2.25;
                                  }
                                  uVar121 = *(undefined8 *)
                                             ((local_ff0 - local_9f4) *
                                              CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2]) *
                                              8 + bx_6.smallend.vect._0_8_ +
                                              (local_f38 - local_9f0) *
                                              CONCAT44(bx_6.bigend.vect[2],bx_6.bigend.vect[1]) * 8
                                             + (lVar42 - local_9f8) * 8);
                                }
                                *(undefined8 *)(local_d80 + lVar100 * 8 + lVar43 * 8 + lVar104 * 8)
                                     = uVar121;
                                lVar42 = lVar42 + 1;
                                lVar41 = lVar41 + 8;
                                pdVar54 = (double *)((long)pdVar54 + 8);
                              } while (result.bigend.vect[0] + 1 != (int)lVar42);
                            }
                            local_ff0 = local_ff0 + 1;
                            local_ef8 = local_ef8 + lVar95 * 8;
                            local_ea0 = (double *)((long)local_ea0 + lVar95 * 8);
                          } while (result.bigend.vect[1] + 1 != (int)local_ff0);
                        }
                        local_f38 = local_f38 + 1;
                        local_d18 = local_d18 + lVar49 * 8;
                        local_c88 = local_c88 + lVar49 * 8;
                      } while (result.bigend.vect[2] + 1 != (int)local_f38);
                    }
                    local_d90 = (long)local_a38.smallend.vect[2];
                    if (local_a38.smallend.vect[2] <= local_a38.bigend.vect[2]) {
                      lVar65 = (long)local_a38.smallend.vect[1];
                      lVar41 = lVar65 * 8 + lVar81 * -8;
                      lVar100 = local_d90 * 8;
                      lVar42 = (lVar96 * 0xd8 + local_d90 * 8 + lVar56 * -8) * lVar36;
                      lVar43 = (lVar96 * 0x68 + local_d90 * 8 + lVar56 * -8) * lVar36;
                      lVar44 = (lVar96 * 0x50 + local_d90 * 8 + lVar56 * -8) * lVar36;
                      lVar45 = (lVar96 * 0x60 + local_d90 * 8 + lVar56 * -8) * lVar36;
                      lVar59 = (long)local_a38.smallend.vect[0];
                      lVar50 = local_d90 * 8;
                      lVar101 = local_d90 * 8;
                      lVar79 = local_d90 * 8;
                      lVar51 = lVar59 * 8 + lVar107 * -8 + lVar80;
                      iVar48 = ~iVar28 + local_a38.smallend.vect[2];
                      local_c10 = (lVar42 + lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 +
                                  lVar107 * -8 + lVar80;
                      local_c18 = ((lVar100 + lVar96 * 0x48 + lVar56 * -8) * lVar36 + lVar65 * 8 +
                                  lVar81 * -8) * lVar95 + lVar59 * 8 + lVar107 * -8 + lVar80;
                      local_e78 = ((lVar96 * 0x90 + local_d90 * 8 + lVar56 * -8) * lVar36 +
                                   lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 + lVar107 * -8 +
                                  lVar80;
                      local_eb8 = ((lVar96 * 0xb0 + local_d90 * 8 + lVar56 * -8) * lVar36 +
                                   lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 + lVar107 * -8 +
                                  lVar80;
                      local_d28 = (lVar43 + lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 +
                                  lVar107 * -8 + lVar80;
                      local_d30 = ((lVar96 * 0x20 + local_d90 * 8 + lVar56 * -8) * lVar36 +
                                   lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 + lVar107 * -8 +
                                  lVar80;
                      local_d00 = (lVar65 * 8 + (local_d90 - lVar56) * lVar36 * 8 + lVar81 * -8) *
                                  lVar95 + lVar59 * 8 + lVar107 * -8 + lVar80;
                      local_d08 = (lVar44 + lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 +
                                  lVar107 * -8 + lVar80;
                      local_ca8 = ((lVar96 * 0x98 + local_d90 * 8 + lVar56 * -8) * lVar36 +
                                   lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 + lVar107 * -8 +
                                  lVar80;
                      local_cb0 = ((lVar96 * 8 + local_d90 * 8 + lVar56 * -8) * lVar36 + lVar65 * 8
                                  + lVar81 * -8) * lVar95 + lVar59 * 8 + lVar107 * -8 + lVar80;
                      local_cb8 = lVar59 * 8 +
                                  ((lVar96 * 0xa8 + local_d90 * 8 + lVar56 * -8) * lVar36 +
                                   lVar65 * 8 + lVar81 * -8) * lVar95 + lVar107 * -8 + lVar80;
                      local_cc0 = ((lVar96 * 0x18 + local_d90 * 8 + lVar56 * -8) * lVar36 +
                                   lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 + lVar107 * -8 +
                                  lVar80;
                      local_cc8 = (lVar45 + lVar65 * 8 + lVar81 * -8) * lVar95 + lVar59 * 8 +
                                  lVar107 * -8 + lVar80;
                      local_d88 = (lVar96 * 0x28 + local_d90 * 8 + lVar56 * -8) * lVar36;
                      local_d38 = ((lVar93 * 8 + local_d90 * 8 + lVar84 * -8) * lVar63 + lVar65 * 8
                                  + uVar134 * -8) * lVar62 + lVar59 * 8 + lVar35 * -8 +
                                  (long)pdVar33;
                      lVar104 = lVar63 * lVar62 * 8;
                      local_c20 = ((lVar93 * 0x10 + local_d90 * 8 + lVar84 * -8) * lVar63 +
                                   lVar65 * 8 + uVar134 * -8) * lVar62 + lVar59 * 8 + lVar35 * -8 +
                                  (long)pdVar33;
                      local_c28 = ((lVar100 + lVar93 * 0x18 + lVar84 * -8) * lVar63 + lVar65 * 8 +
                                  uVar134 * -8) * lVar62 + lVar59 * 8 + lVar35 * -8 + (long)pdVar33;
                      local_c30 = ((lVar93 * 0x20 + local_d90 * 8 + lVar84 * -8) * lVar63 +
                                   lVar65 * 8 + uVar134 * -8) * lVar62 + lVar59 * 8 + lVar35 * -8 +
                                  (long)pdVar33;
                      local_c38 = ((lVar100 + lVar93 * 0x28 + lVar84 * -8) * lVar63 + lVar65 * 8 +
                                  uVar134 * -8) * lVar62 + lVar59 * 8 + lVar35 * -8 + (long)pdVar33;
                      local_e80 = ((lVar93 * 0x30 + local_d90 * 8 + lVar84 * -8) * lVar63 +
                                   lVar65 * 8 + uVar134 * -8) * lVar62 + lVar59 * 8 + lVar35 * -8 +
                                  (long)pdVar33;
                      local_c40 = ((lVar93 * 0x38 + local_d90 * 8 + lVar84 * -8) * lVar63 +
                                   lVar65 * 8 + uVar134 * -8) * lVar62 + lVar59 * 8 + lVar35 * -8 +
                                  (long)pdVar33;
                      lVar107 = lVar95 * 8;
                      lVar100 = lVar49 * 8;
                      lVar59 = lVar62 * 8;
                      local_d78 = lVar51;
                      do {
                        if (local_a38.smallend.vect[1] <= local_a38.bigend.vect[1]) {
                          lVar40 = (long)iVar48;
                          lVar55 = (lVar96 * 0xd8 + lVar40 * 8) * lVar36;
                          lVar108 = (lVar41 + lVar55) * lVar95 + lVar51;
                          lVar58 = ((lVar96 * 0x58 + lVar40 * 8) * lVar36 + lVar41) * lVar95 +
                                   lVar51;
                          lVar39 = ((lVar96 * 0xa0 + lVar40 * 8) * lVar36 + lVar41) * lVar95 +
                                   lVar51;
                          local_f48 = ((lVar96 * 0x20 + lVar40 * 8) * lVar36 + lVar41) * lVar95 +
                                      lVar51;
                          lVar86 = ((lVar96 * 8 + lVar40 * 8) * lVar36 + lVar41) * lVar95 + lVar51;
                          lVar85 = ((lVar96 * 0xb8 + lVar40 * 8) * lVar36 + lVar41) * lVar95 +
                                   lVar51;
                          lVar103 = ((lVar96 * 0x18 + lVar40 * 8) * lVar36 + lVar41) * lVar95 +
                                    lVar51;
                          lVar97 = (lVar96 * 0x70 + lVar40 * 8) * lVar36;
                          lVar76 = (lVar41 + lVar97) * lVar95 + lVar51;
                          lVar64 = (local_d90 - lVar56) * lVar49;
                          lVar46 = (~iVar28 + (int)local_d90) * lVar49;
                          local_ee8 = local_c38;
                          local_ee0 = local_c30;
                          local_f88 = local_c28;
                          local_f40 = local_c20;
                          local_f50 = local_d38;
                          local_fb8 = (double *)local_cc8;
                          local_f98 = local_cc0;
                          local_fe8 = (double *)local_cb8;
                          local_fa0 = (double *)local_cb0;
                          local_f90 = local_ca8;
                          local_f70 = local_d08;
                          local_f78 = local_d00;
                          local_fe0 = local_d30;
                          local_f58 = local_d28;
                          local_f38 = local_eb8;
                          local_f60 = local_e78;
                          local_ec8 = local_c18;
                          lVar77 = local_c40;
                          lVar92 = local_e80;
                          lVar89 = local_c10;
                          local_e20 = lVar65;
                          iVar66 = ~iVar105 + local_a38.smallend.vect[1];
                          do {
                            if (local_a38.smallend.vect[0] <= local_a38.bigend.vect[0]) {
                              lVar102 = (long)iVar66;
                              lVar99 = (lVar42 + lVar102 * 8) * lVar95 + local_d78;
                              lVar90 = ((lVar96 * 200 + lVar79 + lVar56 * -8) * lVar36 + lVar102 * 8
                                       ) * lVar95 + local_d78;
                              lVar98 = (local_d88 + lVar102 * 8) * lVar95 + local_d78;
                              lVar109 = (local_e20 - lVar81) * lVar95;
                              lVar110 = (~iVar105 + (int)local_e20) * lVar95;
                              lVar91 = 0;
                              do {
                                *(double *)(local_f50 + lVar91 * 8) =
                                     (*(double *)
                                       (((lVar96 * 0x28 + lVar40 * 8) * lVar36 + lVar102 * 8) *
                                        lVar95 + lVar51 + lVar91 * 8) * local_668 +
                                     *(double *)
                                      (((lVar96 * 0xd0 + lVar40 * 8) * lVar36 + lVar102 * 8) *
                                       lVar95 + lVar51 + lVar91 * 8) * local_5e8 +
                                     *(double *)
                                      ((lVar97 + lVar102 * 8) * lVar95 + lVar51 + lVar91 * 8) *
                                     local_648) *
                                     *(double *)
                                      ((lVar55 + lVar102 * 8) * lVar95 + lVar51 + lVar91 * 8) +
                                     (*(double *)(lVar103 + lVar91 * 8) * local_668 +
                                     *(double *)(lVar39 + lVar91 * 8) * local_5e8 +
                                     *(double *)(lVar76 + lVar91 * 8) * local_648) *
                                     *(double *)(lVar108 + lVar91 * 8) +
                                     (*(double *)(local_f98 + lVar91 * 8) * local_668 +
                                     *(double *)(local_f60 + lVar91 * 8) * local_5e8 +
                                     *(double *)((long)local_fb8 + lVar91 * 8) * local_648) *
                                     *(double *)(lVar89 + lVar91 * 8) +
                                     (*(double *)(lVar98 + lVar91 * 8) * local_668 +
                                     *(double *)
                                      (((lVar96 * 0xc0 + lVar101 + lVar56 * -8) * lVar36 +
                                       lVar102 * 8) * lVar95 + local_d78 + lVar91 * 8) * local_5e8 +
                                     *(double *)
                                      ((lVar45 + lVar102 * 8) * lVar95 + local_d78 + lVar91 * 8) *
                                     local_648) * *(double *)(lVar99 + lVar91 * 8);
                                lVar87 = (long)(~iVar69 + local_a38.smallend.vect[0] + (int)lVar91);
                                lVar4 = local_d80 + lVar109 * 8 + lVar87 * 8;
                                lVar5 = lVar80 + lVar109 * 8 + lVar87 * 8;
                                lVar6 = lVar5 + lVar64 * 8;
                                lVar5 = lVar5 + lVar46 * 8;
                                *(double *)(local_f40 + lVar91 * 8) =
                                     (*(double *)(lVar5 + lVar106 * 0x38) * local_668 +
                                     *(double *)(lVar5 + lVar106 * 0xb8) * local_608 +
                                     *(double *)(lVar106 * 0x88 + lVar5) * local_5f8) *
                                     *(double *)(lVar4 + lVar46 * 8) +
                                     (*(double *)(lVar86 + lVar91 * 8) * local_668 +
                                     *(double *)(lVar85 + lVar91 * 8) * local_608 +
                                     *(double *)(lVar58 + lVar91 * 8) * local_5f8) *
                                     *(double *)(lVar108 + lVar91 * 8) +
                                     (*(double *)((long)local_fa0 + lVar91 * 8) * local_668 +
                                     *(double *)((long)local_fe8 + lVar91 * 8) * local_608 +
                                     *(double *)(local_ec8 + lVar91 * 8) * local_5f8) *
                                     *(double *)(lVar89 + lVar91 * 8) +
                                     (*(double *)(lVar6 + lVar106 * 0x38) * local_668 +
                                     *(double *)(lVar6 + lVar106 * 0xa8) * local_608 +
                                     *(double *)(lVar106 * 0x78 + lVar6) * local_5f8) *
                                     *(double *)(lVar4 + lVar64 * 8);
                                lVar5 = lVar80 + lVar110 * 8 + lVar64 * 8 + lVar87 * 8;
                                *(double *)(local_f88 + lVar91 * 8) =
                                     (*(double *)(lVar106 * 0x40 + lVar5) * local_658 +
                                     *(double *)(lVar5 + lVar106 * 200) * local_608 +
                                     *(double *)(lVar5 + lVar106 * 0x80) * local_648) *
                                     *(double *)(local_d80 + lVar110 * 8 + lVar64 * 8 + lVar87 * 8)
                                     + (*(double *)
                                         (((lVar96 * 0x10 + lVar50 + lVar56 * -8) * lVar36 +
                                          lVar102 * 8) * lVar95 + local_d78 + lVar91 * 8) *
                                        local_658 +
                                       *(double *)(lVar90 + lVar91 * 8) * local_608 +
                                       *(double *)
                                        ((lVar44 + lVar102 * 8) * lVar95 + local_d78 + lVar91 * 8) *
                                       local_648) * *(double *)(lVar99 + lVar91 * 8) +
                                       (*(double *)(local_f78 + lVar91 * 8) * local_658 +
                                       *(double *)(local_f90 + lVar91 * 8) * local_608 +
                                       *(double *)(local_f70 + lVar91 * 8) * local_648) *
                                       *(double *)(lVar89 + lVar91 * 8) +
                                       (*(double *)(lVar106 * 0x30 + lVar6) * local_658 +
                                       *(double *)(lVar6 + lVar106 * 0x98) * local_608 +
                                       *(double *)(lVar6 + lVar106 * 0x80) * local_648) *
                                       *(double *)(lVar4 + lVar64 * 8);
                                *(double *)(local_ee0 + lVar91 * 8) =
                                     (*(double *)(local_fe0 + lVar91 * 8) * local_678 +
                                     *(double *)((long)local_fe8 + lVar91 * 8) * local_638 +
                                     *(double *)((long)local_fb8 + lVar91 * 8) *
                                     (double)local_5d8._0_8_) * *(double *)(lVar89 + lVar91 * 8) +
                                     (*(double *)(local_f48 + lVar91 * 8) * local_678 +
                                     *(double *)(lVar85 + lVar91 * 8) * local_638 +
                                     *(double *)(lVar76 + lVar91 * 8) * (double)local_5d8._0_8_) *
                                     *(double *)(lVar108 + lVar91 * 8);
                                *(double *)(local_ee8 + lVar91 * 8) =
                                     (*(double *)(local_f98 + lVar91 * 8) * local_558 +
                                     *(double *)(local_f90 + lVar91 * 8) * local_638 +
                                     *(double *)(local_f58 + lVar91 * 8) * local_628) *
                                     *(double *)(lVar89 + lVar91 * 8) +
                                     (*(double *)(lVar98 + lVar91 * 8) * local_558 +
                                     *(double *)(lVar90 + lVar91 * 8) * local_638 +
                                     *(double *)
                                      ((lVar43 + lVar102 * 8) * lVar95 + local_d78 + lVar91 * 8) *
                                     local_628) * *(double *)(lVar99 + lVar91 * 8);
                                *(double *)(lVar92 + lVar91 * 8) =
                                     (*(double *)((long)local_fa0 + lVar91 * 8) * local_558 +
                                     *(double *)(local_f38 + lVar91 * 8) * local_618 +
                                     *(double *)(local_f70 + lVar91 * 8) * (double)local_5d8._0_8_)
                                     * *(double *)(lVar89 + lVar91 * 8) +
                                     (*(double *)(lVar6 + lVar106 * 0x38) * local_558 +
                                     *(double *)(lVar6 + lVar106 * 0xb0) * local_618 +
                                     *(double *)(lVar6 + lVar106 * 0x80) * (double)local_5d8._0_8_)
                                     * *(double *)(lVar4 + lVar64 * 8);
                                *(double *)(lVar77 + lVar91 * 8) =
                                     (*(double *)(local_fe0 + lVar91 * 8) * facz_2 +
                                     *(double *)(local_f38 + lVar91 * 8) * facx_2 +
                                     *(double *)(local_f58 + lVar91 * 8) * facy_2) *
                                     *(double *)(lVar89 + lVar91 * 8);
                                lVar91 = lVar91 + 1;
                              } while ((local_a38.bigend.vect[0] - local_a38.smallend.vect[0]) + 1
                                       != (int)lVar91);
                            }
                            local_e20 = local_e20 + 1;
                            lVar108 = lVar108 + lVar107;
                            lVar89 = lVar89 + lVar107;
                            lVar58 = lVar58 + lVar107;
                            lVar39 = lVar39 + lVar107;
                            local_f48 = local_f48 + lVar107;
                            lVar86 = lVar86 + lVar107;
                            lVar85 = lVar85 + lVar107;
                            lVar103 = lVar103 + lVar107;
                            lVar76 = lVar76 + lVar107;
                            local_ec8 = local_ec8 + lVar107;
                            local_f60 = local_f60 + lVar107;
                            local_f38 = local_f38 + lVar107;
                            local_f58 = local_f58 + lVar107;
                            local_fe0 = local_fe0 + lVar107;
                            local_f78 = local_f78 + lVar107;
                            local_f70 = local_f70 + lVar107;
                            local_f90 = local_f90 + lVar107;
                            local_fa0 = (double *)((long)local_fa0 + lVar107);
                            local_fe8 = (double *)((long)local_fe8 + lVar107);
                            local_f98 = local_f98 + lVar107;
                            local_fb8 = (double *)((long)local_fb8 + lVar107);
                            iVar66 = iVar66 + 1;
                            local_f50 = local_f50 + lVar59;
                            local_f40 = local_f40 + lVar59;
                            local_f88 = local_f88 + lVar59;
                            local_ee0 = local_ee0 + lVar59;
                            local_ee8 = local_ee8 + lVar59;
                            lVar92 = lVar92 + lVar59;
                            lVar77 = lVar77 + lVar59;
                          } while (local_a38.bigend.vect[1] + 1 != (int)local_e20);
                        }
                        local_d90 = local_d90 + 1;
                        iVar48 = iVar48 + 1;
                        local_c10 = local_c10 + lVar100;
                        local_c18 = local_c18 + lVar100;
                        local_e78 = local_e78 + lVar100;
                        local_eb8 = local_eb8 + lVar100;
                        local_d28 = local_d28 + lVar100;
                        local_d30 = local_d30 + lVar100;
                        local_d00 = local_d00 + lVar100;
                        local_d08 = local_d08 + lVar100;
                        local_ca8 = local_ca8 + lVar100;
                        local_cb0 = local_cb0 + lVar100;
                        local_cb8 = local_cb8 + lVar100;
                        local_cc0 = local_cc0 + lVar100;
                        local_cc8 = local_cc8 + lVar100;
                        local_d78 = local_d78 + lVar100;
                        local_d38 = local_d38 + lVar104;
                        local_c20 = local_c20 + lVar104;
                        local_c28 = local_c28 + lVar104;
                        local_c30 = local_c30 + lVar104;
                        local_c38 = local_c38 + lVar104;
                        local_e80 = local_e80 + lVar104;
                        local_c40 = local_c40 + lVar104;
                      } while (local_a38.bigend.vect[2] + 1 != (int)local_d90);
                    }
                    local_fc0 = (long)local_db8.smallend.vect[2];
                    if (local_db8.smallend.vect[2] <= local_db8.bigend.vect[2]) {
                      lVar56 = (long)local_db8.smallend.vect[0];
                      lVar80 = lVar56 * 8;
                      lVar35 = lVar80 + lVar35 * -8;
                      lVar50 = lVar93 * 0x38 + lVar84 * -8;
                      lVar81 = lVar93 * 0x28 + lVar84 * -8;
                      lVar96 = lVar93 * 0x30 + lVar84 * -8;
                      lVar95 = lVar93 * 0x18 + lVar84 * -8;
                      lVar49 = uVar134 * -8;
                      lVar36 = ~uVar134 * 8;
                      do {
                        if (local_db8.smallend.vect[1] <= local_db8.bigend.vect[1]) {
                          lVar107 = bx_1.smallend.vect._0_8_ + lVar56 * 4;
                          lVar106 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4;
                          lVar100 = (local_fc0 - (int)local_bc0) * lVar106 + (long)local_bc8 * -4 +
                                    lVar107;
                          lVar42 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4;
                          lVar107 = lVar106 * ((local_fc0 + -1) - (long)(int)local_bc0) +
                                    (long)local_bc8 * -4 + lVar107;
                          lVar59 = (lVar50 + -8 + local_fc0 * 8) * lVar63;
                          lVar43 = (lVar50 + local_fc0 * 8) * lVar63;
                          lVar106 = (lVar93 * 0x20 + lVar84 * -8 + local_fc0 * 8) * lVar63;
                          local_d80 = lVar49 + lVar59;
                          local_d78 = lVar106 + lVar36;
                          lVar79 = (lVar96 + -8 + local_fc0 * 8) * lVar63;
                          lVar41 = (lVar96 + local_fc0 * 8) * lVar63;
                          lVar101 = (lVar93 * 0x10 + lVar84 * -8 + local_fc0 * 8) * lVar63;
                          local_d88 = lVar49 + lVar79;
                          local_d90 = (long)local_a78.begin.y;
                          local_fe8 = (double *)(long)local_db8.smallend.vect[1];
                          do {
                            if (local_db8.smallend.vect[0] <= local_db8.bigend.vect[0]) {
                              lVar77 = (long)local_fe8 - (long)local_9b0.begin.y;
                              lVar87 = local_9b0.jstride * lVar77;
                              lVar65 = local_fc0 - local_9b0.begin.z;
                              lVar52 = local_9b0.kstride * lVar65;
                              lVar104 = ((long)local_fe8 + -1) - (long)local_9b0.begin.y;
                              lVar53 = local_9b0.jstride * lVar104;
                              lVar45 = (long)(((int)local_fe8 + 1) - local_9b0.begin.y);
                              lVar58 = (local_fc0 + -1) - (long)local_9b0.begin.z;
                              lVar88 = local_9b0.kstride * lVar58;
                              lVar51 = (long)(((int)local_fc0 + 1) - local_9b0.begin.z);
                              lVar82 = local_9b0.kstride * lVar51;
                              lVar44 = local_9b0.kstride * 8;
                              lVar51 = lVar51 * lVar44;
                              lVar58 = lVar58 * lVar44;
                              lVar44 = lVar44 * lVar65;
                              lVar83 = local_9b0.jstride * lVar45;
                              lVar65 = local_9b0.jstride * 8;
                              lVar77 = lVar77 * lVar65;
                              lVar104 = lVar104 * lVar65;
                              lVar65 = lVar65 * lVar45;
                              lVar45 = (long)local_9b0.begin.x;
                              lVar98 = lVar77 + lVar51 + lVar45 * -8 + lVar80;
                              lVar99 = lVar77 + lVar58 + lVar45 * -8 + lVar80;
                              lVar102 = lVar77 + lVar44 + lVar45 * -8 + lVar80;
                              lVar109 = lVar104 + lVar51 + lVar45 * -8 + lVar80;
                              lVar110 = lVar104 + lVar58 + lVar45 * -8 + lVar80;
                              lVar91 = lVar104 + lVar44 + lVar45 * -8 + lVar80;
                              lVar4 = lVar51 + lVar65 + lVar45 * -8 + lVar80;
                              lVar6 = lVar58 + lVar65 + lVar45 * -8 + lVar80;
                              lVar5 = lVar65 + lVar44 + lVar45 * -8 + lVar80;
                              lVar90 = ((long)local_fe8 - local_d90) * local_a78.jstride * 8 +
                                       (local_fc0 - local_a78.begin.z) * local_a78.kstride * 8 +
                                       (long)local_a78.begin.x * -8 + lVar80;
                              lVar60 = (((long)local_fe8 + -1) - (long)(int)local_bc4) * lVar42;
                              lVar44 = lVar100 + lVar60;
                              lVar60 = lVar60 + lVar107;
                              lVar71 = ((long)local_fe8 - (long)(int)local_bc4) * lVar42;
                              lVar45 = lVar100 + lVar71;
                              lVar71 = lVar71 + lVar107;
                              lVar51 = (local_d80 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar65 = ((lVar81 + -8 + local_fc0 * 8) * lVar63 + lVar49 +
                                       (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar104 = (lVar49 + lVar43 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar58 = ((lVar81 + local_fc0 * 8) * lVar63 + lVar49 +
                                       (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar77 = (lVar49 + lVar106 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar92 = ((lVar93 * 8 + lVar84 * -8 + local_fc0 * 8) * lVar63 + lVar49
                                       + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar89 = (lVar59 + lVar36 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar97 = (lVar43 + lVar36 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar46 = (local_d78 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar55 = (local_d88 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar76 = ((lVar95 + -8 + local_fc0 * 8) * lVar63 + lVar49 +
                                       (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar39 = ((local_fc0 - lVar84) * lVar63 * 8 + lVar49 +
                                       (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar108 = (lVar49 + lVar41 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar64 = ((lVar95 + local_fc0 * 8) * lVar63 + lVar49 +
                                       (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar103 = (lVar49 + lVar101 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar40 = (lVar79 + lVar36 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar85 = (lVar41 + lVar36 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar86 = (lVar101 + lVar36 + (long)local_fe8 * 8) * lVar62 + lVar35;
                              lVar72 = 0;
                              do {
                                *(double *)((long)pdVar33 + lVar72 * 8 + lVar39) =
                                     -(*(double *)((long)pdVar33 + lVar72 * 8 + lVar92 + -8) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar92) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar86) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar103) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar76) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar64) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar46 + -8) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar46) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar77 + -8) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar77) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar65 + -8) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar65) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar58 + -8) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar58) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar40) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar55) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar85) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar108) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar89 + -8) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar89) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar51 + -8) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar51) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar97 + -8) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar97) +
                                       *(double *)((long)pdVar33 + lVar72 * 8 + lVar104 + -8) +
                                      *(double *)((long)pdVar33 + lVar72 * 8 + lVar104));
                                *(double *)
                                 ((long)pdVar33 +
                                 lVar72 * 8 +
                                 ((lVar93 * 0x40 + lVar84 * -8 + local_fc0 * 8) * lVar63 + lVar49 +
                                 (long)local_fe8 * 8) * lVar62 + lVar35) =
                                     1.0 / (ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar104)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar104 + -8)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar97)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar97 + -8)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar51)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar51 + -8)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar89)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar89 + -8)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar108)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar85)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar55)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar40)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar58)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar58 + -8)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar65)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar65 + -8)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar77)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar77 + -8)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar46)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar46 + -8)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar64)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar76)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar103)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar86)) +
                                            ABS(*(double *)((long)pdVar33 + lVar72 * 8 + lVar92)) +
                                            ABS(*(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar92 + -8)) +
                                           1e-100);
                                dVar119 = 0.0;
                                if (*(int *)((long)local_af8.p +
                                            lVar72 * 4 +
                                            ((long)local_fe8 - (long)local_af8.begin.y) *
                                            local_af8.jstride * 4 +
                                            (local_fc0 - local_af8.begin.z) * local_af8.kstride * 4
                                            + (long)local_af8.begin.x * -4 + lVar56 * 4) == 0) {
                                  lVar111 = (long)(((local_db8.smallend.vect[0] + 1) -
                                                   local_9b0.begin.x) + (int)lVar72);
                                  dVar119 = local_9b0.p[lVar83 + lVar111 + lVar82] *
                                            *(double *)((long)pdVar33 + lVar72 * 8 + lVar104) +
                                            *(double *)((long)local_9b0.p + lVar72 * 8 + lVar4 + -8)
                                            * *(double *)((long)pdVar33 + lVar72 * 8 + lVar104 + -8)
                                            + local_9b0.p[lVar53 + lVar111 + lVar82] *
                                              *(double *)((long)pdVar33 + lVar72 * 8 + lVar97) +
                                              *(double *)
                                               ((long)local_9b0.p + lVar72 * 8 + lVar109 + -8) *
                                              *(double *)((long)pdVar33 + lVar72 * 8 + lVar97 + -8)
                                              + local_9b0.p[lVar83 + lVar111 + lVar88] *
                                                *(double *)((long)pdVar33 + lVar72 * 8 + lVar51) +
                                                *(double *)
                                                 ((long)local_9b0.p + lVar72 * 8 + lVar6 + -8) *
                                                *(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar51 + -8) +
                                                local_9b0.p[lVar53 + lVar111 + lVar88] *
                                                *(double *)((long)pdVar33 + lVar72 * 8 + lVar89) +
                                                *(double *)
                                                 ((long)local_9b0.p + lVar72 * 8 + lVar110 + -8) *
                                                *(double *)
                                                 ((long)pdVar33 + lVar72 * 8 + lVar89 + -8) +
                                                *(double *)((long)local_9b0.p + lVar72 * 8 + lVar4)
                                                * *(double *)((long)pdVar33 + lVar72 * 8 + lVar108)
                                                + *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar109) *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar85) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar6) *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar55) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar110) *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar40) +
                                                  local_9b0.p[lVar87 + lVar111 + lVar82] *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar58) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar98 + -8) *
                                                  *(double *)
                                                   ((long)pdVar33 + lVar72 * 8 + lVar58 + -8) +
                                                  local_9b0.p[lVar87 + lVar111 + lVar88] *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar65) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar99 + -8) *
                                                  *(double *)
                                                   ((long)pdVar33 + lVar72 * 8 + lVar65 + -8) +
                                                  local_9b0.p[lVar83 + lVar111 + lVar52] *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar77) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar5 + -8) *
                                                  *(double *)
                                                   ((long)pdVar33 + lVar72 * 8 + lVar77 + -8) +
                                                  local_9b0.p[lVar53 + lVar111 + lVar52] *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar46) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar91 + -8) *
                                                  *(double *)
                                                   ((long)pdVar33 + lVar72 * 8 + lVar46 + -8) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar98) *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar64) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar99) *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar76) +
                                                  *(double *)
                                                   ((long)local_9b0.p + lVar72 * 8 + lVar5) *
                                                  *(double *)((long)pdVar33 + lVar72 * 8 + lVar103)
                                                  + *(double *)
                                                     ((long)local_9b0.p + lVar72 * 8 + lVar91) *
                                                    *(double *)((long)pdVar33 + lVar72 * 8 + lVar86)
                                                    + local_9b0.p[lVar87 + lVar111 + lVar52] *
                                                      *(double *)
                                                       ((long)pdVar33 + lVar72 * 8 + lVar92) +
                                                      *(double *)
                                                       ((long)local_9b0.p + lVar72 * 8 + lVar102) *
                                                      *(double *)
                                                       ((long)pdVar33 + lVar72 * 8 + lVar39) +
                                                      *(double *)
                                                       ((long)local_9b0.p +
                                                       lVar72 * 8 + lVar102 + -8) *
                                                      *(double *)
                                                       ((long)pdVar33 + lVar72 * 8 + lVar92 + -8);
                                }
                                *(double *)((long)local_a78.p + lVar72 * 8 + lVar90) = dVar119;
                                if (((*(int *)(lVar60 + -4 + lVar72 * 4) == 0) ||
                                    (*(int *)(lVar60 + lVar72 * 4) == 0)) ||
                                   ((((*(int *)(lVar71 + -4 + lVar72 * 4) == 0 ||
                                      (((*(int *)(lVar71 + lVar72 * 4) == 0 ||
                                        (*(int *)(lVar44 + -4 + lVar72 * 4) == 0)) ||
                                       (*(int *)(lVar44 + lVar72 * 4) == 0)))) ||
                                     ((*(int *)(lVar45 + -4 + lVar72 * 4) == 0 ||
                                      (dVar128 = 0.0, *(int *)(lVar45 + lVar72 * 4) == 0)))) &&
                                    ((*(int *)(lVar71 + -4 + lVar72 * 4) == 0 ||
                                     (((*(int *)(lVar71 + lVar72 * 4) == 0 ||
                                       (*(int *)(lVar44 + -4 + lVar72 * 4) == 0)) ||
                                      ((*(int *)(lVar44 + lVar72 * 4) == 0 ||
                                       ((*(int *)(lVar45 + -4 + lVar72 * 4) == 0 ||
                                        (dVar128 = 0.0, *(int *)(lVar45 + lVar72 * 4) == 0))))))))))
                                   )) {
                                  if (((bx.smallend.vect[0] - lVar56 != lVar72) ||
                                      ((dVar128 = 2.0, iVar47 != 0x66 &&
                                       (dVar128 = 2.0, iVar47 != 0x6a)))) &&
                                     (dVar128 = 1.0, bx.bigend.vect[0] - lVar56 == lVar72)) {
                                    dVar128 = dVar10;
                                  }
                                  if (((local_fe8 == (double *)(long)bx.smallend.vect[1]) &&
                                      (((int)local_d70 == 0x6a || ((int)local_d70 == 0x66)))) ||
                                     ((local_fe8 == (double *)(long)bx.bigend.vect[1] &&
                                      ((iVar154 == 0x6a || (iVar154 == 0x66)))))) {
                                    dVar128 = dVar128 + dVar128;
                                  }
                                  if (((local_fc0 == bx.smallend.vect[2]) &&
                                      ((LVar21 == inflow || (LVar21 == Neumann)))) ||
                                     ((local_fc0 == bx.bigend.vect[2] &&
                                      ((LVar22 == inflow || (LVar22 == Neumann)))))) {
                                    dVar128 = dVar128 + dVar128;
                                  }
                                  dVar128 = (*(double *)
                                              ((long)pdVar32 +
                                              lVar72 * 8 +
                                              ((local_fc0 - lVar61) * lVar73 * 8 + lVar74 * -8 +
                                              (long)local_fe8 * 8) * lVar70 + lVar80 + lVar75 * -8)
                                            - dVar119) * dVar128;
                                }
                                *(double *)((long)local_a78.p + lVar72 * 8 + lVar90) = dVar128;
                                lVar72 = lVar72 + 1;
                              } while ((local_db8.bigend.vect[0] - local_db8.smallend.vect[0]) + 1
                                       != (int)lVar72);
                            }
                            local_fe8 = (double *)((long)local_fe8 + 1);
                          } while ((int)local_fe8 != local_db8.bigend.vect[1] + 1);
                        }
                        local_fc0 = local_fc0 + 1;
                      } while (local_db8.bigend.vect[2] + 1 != (int)local_fc0);
                    }
                    bx_5.smallend.vect._0_8_ = uVar120;
                    Gpu::Elixir::~Elixir(&cneli);
                    Gpu::Elixir::~Elixir(&steneli);
                  }
                  else {
                    BATransformer::operator()
                              (&bx_4,(BATransformer *)
                                     (CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) + 8),
                               (Box *)((long)((mfi_1.index_map)->
                                             super_vector<int,_std::allocator<int>_>).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[mfi_1.currentIndex] *
                                       0x1c + **(long **)(CONCAT44(mfi_1.fabArray._4_4_,
                                                                   (int)mfi_1.fabArray) + 0x50)));
                    bx_6.bigend.vect[1] = bx_4.bigend.vect[1];
                    bx_6.bigend.vect[2] = bx_4.bigend.vect[2];
                    bx_6.btype = bx_4.btype;
                    bx_6.smallend.vect[0] = bx_4.smallend.vect[0];
                    bx_6.smallend.vect[1] = bx_4.smallend.vect[1];
                    uVar120 = bx_6.smallend.vect._0_8_;
                    bx_6.smallend.vect[2] = bx_4.smallend.vect[2];
                    bx_6.bigend.vect[0] = bx_4.bigend.vect[0];
                    lVar35 = 0;
                    do {
                      if ((bx_4.btype.itype >> ((uint)lVar35 & 0x1f) & 1) != 0) {
                        piVar37 = bx_6.bigend.vect + lVar35;
                        *piVar37 = *piVar37 + -1;
                      }
                      lVar35 = lVar35 + 1;
                    } while (lVar35 != 3);
                    lVar35 = (long)bx_2.smallend.vect[0];
                    lVar63 = (long)bx_2.smallend.vect[2];
                    bx_6.smallend.vect[0] = bx_4.smallend.vect[0];
                    bx_6.smallend.vect[1] = bx_4.smallend.vect[1];
                    iVar69 = bx_6.smallend.vect[0];
                    if (bx_6.smallend.vect[0] < bx_2.smallend.vect[0]) {
                      iVar69 = bx_2.smallend.vect[0];
                    }
                    iVar105 = bx_6.smallend.vect[1];
                    if (bx_6.smallend.vect[1] < bx_2.smallend.vect[1]) {
                      iVar105 = bx_2.smallend.vect[1];
                    }
                    iVar28 = bx_4.smallend.vect[2];
                    if (bx_4.smallend.vect[2] < bx_2.smallend.vect[2]) {
                      iVar28 = bx_2.smallend.vect[2];
                    }
                    iVar48 = bx_6.bigend.vect[0];
                    if (bx_2.bigend.vect[0] < bx_6.bigend.vect[0]) {
                      iVar48 = bx_2.bigend.vect[0];
                    }
                    iVar66 = bx_6.bigend.vect[1];
                    if (bx_2.bigend.vect[1] < bx_6.bigend.vect[1]) {
                      iVar66 = bx_2.bigend.vect[1];
                    }
                    iVar67 = bx_6.bigend.vect[2];
                    if (bx_2.bigend.vect[2] < bx_6.bigend.vect[2]) {
                      iVar67 = bx_2.bigend.vect[2];
                    }
                    this_03 = (FabArray<amrex::FArrayBox> *)*puVar27;
                    bx_6.smallend.vect._0_8_ = uVar120;
                    if (this_03 == (FabArray<amrex::FArrayBox> *)0x0) {
                      if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
                        RVar20 = this->m_const_sigma;
                        local_fe8 = (double *)
                                    (((long)bx_2.smallend.vect[1] * 8 +
                                      (lVar63 - lVar36) * lVar84 * 8 + lVar80 * -8) * lVar50 +
                                     lVar35 * 8 + lVar49 * -8 + (long)pdVar33);
                        do {
                          lVar93 = (long)bx_2.smallend.vect[1];
                          pdVar54 = local_fe8;
                          if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
                            do {
                              if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                                lVar81 = 0;
                                do {
                                  if ((((((lVar35 + lVar81 < (long)iVar69) || (lVar93 < iVar105)) ||
                                        (lVar63 < iVar28)) ||
                                       (((long)iVar48 < lVar35 + lVar81 || (iVar66 < lVar93)))) ||
                                      (iVar67 < lVar63)) ||
                                     (RVar129 = RVar20,
                                     *(int *)((lVar63 - (int)local_bc0) *
                                              CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4
                                              + (lVar93 - (int)local_bc4) *
                                                CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2])
                                                * 4 + (long)local_bc8 * -4 +
                                              bx_1.smallend.vect._0_8_ + lVar35 * 4 + lVar81 * 4) ==
                                     0)) {
                                    RVar129 = 0.0;
                                  }
                                  *(Real *)((long)pdVar54 + lVar81 * 8) = RVar129;
                                  lVar81 = lVar81 + 1;
                                } while ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 !=
                                         (int)lVar81);
                              }
                              lVar93 = lVar93 + 1;
                              pdVar54 = (double *)((long)pdVar54 + lVar50 * 8);
                            } while (bx_2.bigend.vect[1] + 1 != (int)lVar93);
                          }
                          lVar63 = lVar63 + 1;
                          local_fe8 = (double *)((long)local_fe8 + lVar62 * 8);
                        } while (bx_2.bigend.vect[2] + 1 != (int)lVar63);
                      }
                    }
                    else {
                      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                                ((Array4<const_double> *)&bx_6,this_03,&mfi_1);
                      lVar35 = (long)bx_2.smallend.vect[2];
                      if (bx_2.smallend.vect[2] <= bx_2.bigend.vect[2]) {
                        lVar63 = (long)bx_2.smallend.vect[0];
                        lVar93 = ((long)bx_2.smallend.vect[1] * 8 + (lVar35 - lVar36) * lVar84 * 8 +
                                 lVar80 * -8) * lVar50 + lVar63 * 8 + lVar49 * -8 + (long)pdVar33;
                        do {
                          lVar81 = (long)bx_2.smallend.vect[1];
                          lVar56 = lVar93;
                          if (bx_2.smallend.vect[1] <= bx_2.bigend.vect[1]) {
                            do {
                              if (bx_2.smallend.vect[0] <= bx_2.bigend.vect[0]) {
                                lVar95 = 0;
                                do {
                                  uVar120 = 0;
                                  if ((((long)iVar69 <= lVar63 + lVar95) && (iVar105 <= lVar81)) &&
                                     (((iVar28 <= lVar35 &&
                                       (((lVar63 + lVar95 <= (long)iVar48 && (lVar81 <= iVar66)) &&
                                        (lVar35 <= iVar67)))) &&
                                      (*(int *)((lVar81 - (int)local_bc4) *
                                                CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2])
                                                * 4 + (lVar35 - (int)local_bc0) *
                                                      CONCAT44(bx_1.bigend.vect[2],
                                                               bx_1.bigend.vect[1]) * 4 +
                                                (long)local_bc8 * -4 +
                                                bx_1.smallend.vect._0_8_ + lVar63 * 4 + lVar95 * 4)
                                       != 0)))) {
                                    uVar120 = *(undefined8 *)
                                               ((lVar81 - local_9f4) *
                                                CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2])
                                                * 8 + (lVar35 - local_9f0) *
                                                      CONCAT44(bx_6.bigend.vect[2],
                                                               bx_6.bigend.vect[1]) * 8 +
                                                (long)local_9f8 * -8 +
                                                bx_6.smallend.vect._0_8_ + lVar63 * 8 + lVar95 * 8);
                                  }
                                  *(undefined8 *)(lVar56 + lVar95 * 8) = uVar120;
                                  lVar95 = lVar95 + 1;
                                } while ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 !=
                                         (int)lVar95);
                              }
                              lVar81 = lVar81 + 1;
                              lVar56 = lVar56 + lVar50 * 8;
                            } while (bx_2.bigend.vect[1] + 1 != (int)lVar81);
                          }
                          lVar35 = lVar35 + 1;
                          lVar93 = lVar93 + lVar62 * 8;
                        } while (bx_2.bigend.vect[2] + 1 != (int)lVar35);
                      }
                    }
                    lVar35 = (long)local_db8.smallend.vect[2];
                    if (local_db8.smallend.vect[2] <= local_db8.bigend.vect[2]) {
                      local_d78 = (long)local_db8.smallend.vect[1];
                      lVar63 = (long)local_db8.smallend.vect[0];
                      lVar62 = lVar63 * 8;
                      local_d80 = lVar63 * 4;
                      lVar49 = lVar62 + lVar49 * -8;
                      uVar134 = lVar80 * 8 ^ 0xfffffffffffffff8;
                      do {
                        if (local_db8.smallend.vect[1] <= local_db8.bigend.vect[1]) {
                          lVar81 = (long)(int)(~local_bc0 + (int)lVar35);
                          lVar93 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]);
                          lVar96 = lVar93 * lVar81;
                          lVar95 = lVar93 * (lVar35 - (int)local_bc0);
                          lVar106 = (lVar35 - (int)local_bc0) * lVar93 * 4 + (long)local_bc8 * -4 +
                                    bx_1.smallend.vect._0_8_ + local_d80;
                          lVar56 = lVar93 * 4 * lVar81 + (long)local_bc8 * -4 +
                                   bx_1.smallend.vect._0_8_ + local_d80;
                          lVar107 = (lVar35 - lVar36) * lVar84 * 8;
                          lVar101 = ((lVar35 + -1) - lVar36) * lVar84 * 8;
                          lVar93 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]);
                          lVar81 = local_d78;
                          do {
                            iVar69 = (int)lVar81;
                            if (local_db8.smallend.vect[0] <= local_db8.bigend.vect[0]) {
                              lVar43 = lVar81 - local_9b0.begin.y;
                              lVar89 = local_9b0.jstride * lVar43;
                              lVar79 = lVar35 - local_9b0.begin.z;
                              lVar76 = local_9b0.kstride * lVar79;
                              lVar39 = local_9b0.jstride * (lVar43 + -1);
                              lVar59 = (lVar35 + -1) - (long)local_9b0.begin.z;
                              lVar85 = local_9b0.kstride * lVar59;
                              lVar42 = (long)((iVar69 + 1) - local_9b0.begin.y);
                              lVar100 = (long)(((int)lVar35 + 1) - local_9b0.begin.z);
                              lVar86 = (lVar81 - local_a78.begin.y) * local_a78.jstride;
                              lVar90 = (lVar35 - local_a78.begin.z) * local_a78.kstride;
                              lVar64 = (long)local_a78.begin.x;
                              lVar103 = local_9b0.kstride * lVar100;
                              lVar58 = local_9b0.kstride * 8;
                              lVar100 = lVar100 * lVar58;
                              lVar59 = lVar59 * lVar58;
                              lVar58 = lVar58 * lVar79;
                              lVar97 = local_9b0.jstride * lVar42;
                              lVar41 = local_9b0.jstride * 8;
                              lVar45 = lVar43 * lVar41;
                              lVar104 = (lVar43 + -1) * lVar41;
                              lVar41 = lVar41 * lVar42;
                              lVar79 = (long)local_9b0.begin.x;
                              lVar43 = lVar45 + lVar100 + lVar79 * -8 + lVar62;
                              lVar44 = lVar59 + lVar45 + lVar79 * -8 + lVar62;
                              lVar45 = lVar45 + lVar58 + lVar79 * -8 + lVar62;
                              lVar51 = lVar104 + lVar58 + lVar79 * -8 + lVar62;
                              lVar65 = lVar104 + lVar100 + lVar79 * -8 + lVar62;
                              lVar104 = lVar104 + lVar59 + lVar79 * -8 + lVar62;
                              lVar58 = lVar58 + lVar41 + lVar79 * -8 + lVar62;
                              lVar77 = lVar100 + lVar41 + lVar79 * -8 + lVar62;
                              lVar92 = lVar41 + lVar59 + lVar79 * -8 + lVar62;
                              lVar40 = (lVar81 - (int)local_bc4) * lVar93 * 4;
                              lVar79 = lVar106 + lVar40;
                              lVar40 = lVar40 + lVar56;
                              lVar108 = (long)(int)(~local_bc4 + iVar69) * lVar93 * 4;
                              lVar46 = lVar106 + lVar108;
                              lVar100 = (uVar134 + lVar107 + lVar81 * 8) * lVar50 + lVar49;
                              lVar59 = (uVar134 + lVar101 + lVar81 * 8) * lVar50 + lVar49;
                              lVar41 = (lVar107 + lVar80 * -8 + lVar81 * 8) * lVar50 + lVar49;
                              lVar42 = (lVar101 + lVar80 * -8 + lVar81 * 8) * lVar50 + lVar49;
                              lVar55 = 0;
                              do {
                                dVar119 = 0.0;
                                if (*(int *)((long)local_af8.p +
                                            lVar55 * 4 +
                                            (lVar81 - local_af8.begin.y) * local_af8.jstride * 4 +
                                            (lVar35 - local_af8.begin.z) * local_af8.kstride * 4 +
                                            (long)local_af8.begin.x * -4 + local_d80) == 0) {
                                  dVar119 = *(double *)((long)pdVar33 + lVar55 * 8 + lVar59 + -8);
                                  dVar128 = *(double *)((long)pdVar33 + lVar55 * 8 + lVar59);
                                  dVar130 = dVar119 + dVar128;
                                  dVar137 = *(double *)((long)pdVar33 + lVar55 * 8 + lVar42 + -8);
                                  dVar139 = *(double *)((long)pdVar33 + lVar55 * 8 + lVar42);
                                  dVar122 = dVar130 + dVar137 + dVar139;
                                  dVar140 = *(double *)((long)pdVar33 + lVar55 * 8 + lVar100 + -8);
                                  dVar145 = *(double *)((long)pdVar33 + lVar55 * 8 + lVar100);
                                  dVar11 = *(double *)((long)pdVar33 + lVar55 * 8 + lVar41 + -8);
                                  dVar113 = *(double *)((long)pdVar33 + lVar55 * 8 + lVar41);
                                  lVar98 = (long)(((local_db8.smallend.vect[0] + 1) -
                                                  local_9b0.begin.x) + (int)lVar55);
                                  dVar119 = (dVar122 * *(double *)
                                                        ((long)local_9b0.p + lVar55 * 8 + lVar44) +
                                            (dVar140 + dVar145 + dVar11 + dVar113) *
                                            *(double *)((long)local_9b0.p + lVar55 * 8 + lVar43)) *
                                            fm2xm2y4z +
                                            ((dVar130 + dVar140 + dVar145) *
                                             *(double *)((long)local_9b0.p + lVar55 * 8 + lVar51) +
                                            (dVar137 + dVar139 + dVar11 + dVar113) *
                                            *(double *)((long)local_9b0.p + lVar55 * 8 + lVar58)) *
                                            fm2x4ym2z +
                                            ((dVar119 + dVar137 + dVar140 + dVar11) *
                                             *(double *)
                                              ((long)local_9b0.p + lVar55 * 8 + lVar45 + -8) +
                                            (dVar128 + dVar139 + dVar145 + dVar113) *
                                            local_9b0.p[lVar89 + lVar98 + lVar76]) * f4xm2ym2z +
                                            ((dVar139 + dVar113) *
                                             local_9b0.p[lVar97 + lVar98 + lVar76] +
                                            (dVar137 + dVar11) *
                                            *(double *)
                                             ((long)local_9b0.p + lVar55 * 8 + lVar58 + -8) +
                                            (dVar119 + dVar140) *
                                            *(double *)
                                             ((long)local_9b0.p + lVar55 * 8 + lVar51 + -8) +
                                            (dVar128 + dVar145) *
                                            local_9b0.p[lVar39 + lVar98 + lVar76]) * f2x2ymz +
                                            ((dVar145 + dVar113) *
                                             local_9b0.p[lVar89 + lVar98 + lVar103] +
                                            (dVar140 + dVar11) *
                                            *(double *)
                                             ((long)local_9b0.p + lVar55 * 8 + lVar43 + -8) +
                                            *(double *)
                                             ((long)local_9b0.p + lVar55 * 8 + lVar44 + -8) *
                                            (dVar119 + dVar137) +
                                            local_9b0.p[lVar89 + lVar98 + lVar85] *
                                            (dVar128 + dVar139)) * f2xmy2z +
                                            ((dVar11 + dVar113) *
                                             *(double *)((long)local_9b0.p + lVar55 * 8 + lVar77) +
                                            *(double *)((long)local_9b0.p + lVar55 * 8 + lVar65) *
                                            (dVar140 + dVar145) +
                                            *(double *)((long)local_9b0.p + lVar55 * 8 + lVar104) *
                                            dVar130 + *(double *)
                                                       ((long)local_9b0.p + lVar55 * 8 + lVar92) *
                                                      (dVar137 + dVar139)) * fmx2y2z +
                                            (local_9b0.p[lVar97 + lVar98 + lVar103] * dVar113 +
                                            *(double *)
                                             ((long)local_9b0.p + lVar55 * 8 + lVar77 + -8) * dVar11
                                            + local_9b0.p[lVar39 + lVar98 + lVar103] * dVar145 +
                                              *(double *)
                                               ((long)local_9b0.p + lVar55 * 8 + lVar65 + -8) *
                                              dVar140 + local_9b0.p[lVar97 + lVar98 + lVar85] *
                                                        dVar139 + *(double *)
                                                                   ((long)local_9b0.p +
                                                                   lVar55 * 8 + lVar92 + -8) *
                                                                  dVar137 + *(double *)
                                                                             ((long)local_9b0.p +
                                                                             lVar55 * 8 +
                                                                             lVar104 + -8) * dVar119
                                                                            + local_9b0.p
                                                                              [lVar39 + lVar98 + 
                                                  lVar85] * dVar128) * fxyz +
                                            (dVar122 + dVar140 + dVar145 + dVar11 + dVar113) *
                                            *(double *)((long)local_9b0.p + lVar55 * 8 + lVar45) *
                                            -4.0 * fxyz;
                                }
                                *(double *)
                                 ((long)local_a78.p +
                                 lVar55 * 8 +
                                 (lVar81 - local_a78.begin.y) * local_a78.jstride * 8 +
                                 (lVar35 - local_a78.begin.z) * local_a78.kstride * 8 +
                                 (long)local_a78.begin.x * -8 + lVar62) = dVar119;
                                lVar99 = (long)(((local_db8.smallend.vect[0] + -1) - local_bc8) +
                                               (int)lVar55);
                                lVar98 = bx_1.smallend.vect._0_8_ +
                                         lVar93 * (int)(~local_bc4 + iVar69) * 4 + lVar99 * 4;
                                if (((*(int *)(lVar98 + lVar96 * 4) == 0) ||
                                    (*(int *)(lVar108 + lVar56 + lVar55 * 4) == 0)) ||
                                   ((((lVar99 = bx_1.smallend.vect._0_8_ +
                                                lVar93 * (lVar81 - (int)local_bc4) * 4 + lVar99 * 4,
                                      *(int *)(lVar99 + lVar96 * 4) == 0 ||
                                      ((*(int *)(lVar40 + lVar55 * 4) == 0 ||
                                       (*(int *)(lVar98 + lVar95 * 4) == 0)))) ||
                                     ((*(int *)(lVar46 + lVar55 * 4) == 0 ||
                                      ((*(int *)(lVar99 + lVar95 * 4) == 0 ||
                                       (*(int *)(lVar79 + lVar55 * 4) == 0)))))) &&
                                    (((*(int *)(lVar99 + lVar96 * 4) == 0 ||
                                      (((*(int *)(lVar40 + lVar55 * 4) == 0 ||
                                        (*(int *)(lVar98 + lVar95 * 4) == 0)) ||
                                       (*(int *)(lVar46 + lVar55 * 4) == 0)))) ||
                                     ((*(int *)(lVar99 + lVar95 * 4) == 0 ||
                                      (*(int *)(lVar79 + lVar55 * 4) == 0)))))))) {
                                  if (((bx.smallend.vect[0] - lVar63 != lVar55) ||
                                      ((dVar119 = 2.0, iVar47 != 0x66 &&
                                       (dVar119 = 2.0, iVar47 != 0x6a)))) &&
                                     (dVar119 = 1.0, bx.bigend.vect[0] - lVar63 == lVar55)) {
                                    dVar119 = dVar10;
                                  }
                                  if (((lVar81 == bx.smallend.vect[1]) &&
                                      (((int)local_d70 == 0x6a || ((int)local_d70 == 0x66)))) ||
                                     ((lVar81 == bx.bigend.vect[1] &&
                                      ((iVar154 == 0x6a || (iVar154 == 0x66)))))) {
                                    dVar119 = dVar119 + dVar119;
                                  }
                                  if (((lVar35 == bx.smallend.vect[2]) &&
                                      ((LVar21 == inflow || (LVar21 == Neumann)))) ||
                                     ((lVar35 == bx.bigend.vect[2] &&
                                      ((LVar22 == inflow || (LVar22 == Neumann)))))) {
                                    dVar119 = dVar119 + dVar119;
                                  }
                                  local_a78.p[lVar63 + ((lVar86 + lVar90 + lVar55) - lVar64)] =
                                       (*(double *)
                                         ((long)pdVar32 +
                                         lVar55 * 8 +
                                         ((lVar35 - lVar61) * lVar73 * 8 + lVar74 * -8 + lVar81 * 8)
                                         * lVar70 + lVar62 + lVar75 * -8) -
                                       local_a78.p[lVar63 + ((lVar86 + lVar90 + lVar55) - lVar64)])
                                       * dVar119;
                                }
                                else {
                                  local_a78.p[lVar63 + ((lVar86 + lVar90 + lVar55) - lVar64)] = 0.0;
                                }
                                lVar55 = lVar55 + 1;
                              } while ((local_db8.bigend.vect[0] - local_db8.smallend.vect[0]) + 1
                                       != (int)lVar55);
                            }
                            lVar81 = lVar81 + 1;
                          } while (iVar69 + 1 != local_db8.bigend.vect[1] + 1);
                        }
                        lVar35 = lVar35 + 1;
                      } while (local_db8.bigend.vect[2] + 1 != (int)lVar35);
                    }
                  }
                  Gpu::Elixir::~Elixir(&rhseli);
                  Gpu::Elixir::~Elixir(&ueli);
                  goto LAB_005823f4;
                }
LAB_0057957e:
                lVar49 = lVar49 + 1;
                lVar50 = lVar50 + lVar80;
              } while (bx_2.bigend.vect[1] + 1 != (int)lVar49);
            }
            lVar84 = lVar84 + 1;
            lVar35 = lVar35 + lVar36;
          } while (bx_2.bigend.vect[2] + 1 != (int)lVar84);
        }
      }
      else {
        piVar37 = &mfi_1.currentIndex;
        if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar37 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi_1.currentIndex;
        }
        this_02 = (local_9d0->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar37];
        bx_1.bigend.vect[1] = local_db8.bigend.vect[1];
        bx_1.bigend.vect[2] = local_db8.bigend.vect[2];
        bx_1.smallend.vect[1] = local_db8.smallend.vect[1];
        bx_1.smallend.vect[0] = local_db8.smallend.vect[0];
        bx_1.smallend.vect[2] = local_db8.smallend.vect[2];
        bx_1.bigend.vect[0] = local_db8.bigend.vect[0];
        lVar84 = 0;
        do {
          if ((local_db8.btype.itype >> ((uint)lVar84 & 0x1f) & 1) != 0) {
            piVar37 = bx_1.bigend.vect + lVar84;
            *piVar37 = *piVar37 + -1;
          }
          lVar84 = lVar84 + 1;
        } while (lVar84 != 3);
        bx_1.btype.itype = 0;
        FVar34 = EBCellFlagFab::getType(this_02,&bx_1);
        if (FVar34 != covered) goto LAB_0057942d;
      }
LAB_005823f4:
      MFIter::operator++(&mfi_1);
    } while (mfi_1.currentIndex < mfi_1.endIndex);
  }
  MFIter::~MFIter(&mfi_1);
  cn.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
  BaseFab<double>::clear(&cn.super_BaseFab<double>);
  sten.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
  BaseFab<double>::clear(&sten.super_BaseFab<double>);
  u.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
  BaseFab<double>::clear(&u.super_BaseFab<double>);
  rhs.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
  BaseFab<double>::clear(&rhs.super_BaseFab<double>);
  MultiFab::~MultiFab(&phi);
  iMultiFab::~iMultiFab(&crse_cc_mask);
  BoxArray::~BoxArray(&local_280);
  BoxArray::~BoxArray(&local_218);
  return;
code_r0x00579576:
  lVar61 = lVar61 + 1;
  if ((bx_2.bigend.vect[0] - bx_2.smallend.vect[0]) + 1 == (int)lVar61) goto LAB_0057957e;
  goto LAB_0057956f;
}

Assistant:

void
MLNodeLaplacian::compSyncResidualCoarse (MultiFab& sync_resid, const MultiFab& a_phi,
                                         const MultiFab& vold, const MultiFab* rhcc,
                                         const BoxArray& fine_grids, const IntVect& ref_ratio)
{
    BL_PROFILE("MLNodeLaplacian::SyncResCrse()");

    sync_resid.setVal(0.0);

    const Geometry& geom = m_geom[0][0];
    const DistributionMapping& dmap = m_dmap[0][0];
    const BoxArray& ccba = m_grids[0][0];
    const BoxArray& ndba = amrex::convert(ccba, IntVect::TheNodeVector());
    const BoxArray& ccfba = amrex::convert(fine_grids, IntVect::TheZeroVector());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    // cell-center, 1: coarse; 0: covered by fine
    const int owner = 1;
    const int nonowner = 0;
    iMultiFab crse_cc_mask = amrex::makeFineMask(ccba, dmap, IntVect(1), ccfba, ref_ratio,
                                                 geom.periodicity(), owner, nonowner);

    const Box& ccdom = geom.Domain();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crse_cc_mask); mfi.isValid(); ++mfi)
    {
        Array4<int> const& fab = crse_cc_mask.array(mfi);
        mlndlap_fillbc_cc<int>(mfi.validbox(),fab,ccdom,lobc,hibc);
    }

    MultiFab phi(ndba, dmap, 1, 1);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        const Box& gbx = mfi.growntilebox();
        Array4<Real> const& fab = phi.array(mfi);
        Array4<Real const> const& a_fab = a_phi.const_array(mfi);
        Array4<int const> const& msk = crse_cc_mask.const_array(mfi);
        AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
        {
            if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                fab(i,j,k) = a_fab(i,j,k);
                mlndlap_zero_fine(i,j,k,fab,msk,nonowner);
            } else {
                fab(i,j,k) = 0.0;
            }
        });
    }

    const auto& nddom = amrex::surroundingNodes(ccdom);

    const auto dxinv = geom.InvCellSizeArray();

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const auto& sigma_orig = m_sigma[0][0][0];
    const iMultiFab& dmsk = *m_dirichlet_mask[0][0];

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[0][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* intg = m_integral[0].get();
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

    bool neumann_doubling = true; // yes even for RAP, because unimposeNeumannBC will be called on rhs

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox rhs, u;
#ifdef AMREX_USE_EB
        FArrayBox sten, cn;
#endif
        for (MFIter mfi(sync_resid,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();

            auto typ = FabType::regular;
#ifdef AMREX_USE_EB
            if (factory) {
                typ = (*flags)[mfi].getType(amrex::enclosedCells(bx));
            }
#endif
            if (typ != FabType::covered)
            {
                const Box& bxg1 = amrex::grow(bx,1);
                const Box& ccbxg1 = amrex::enclosedCells(bxg1);
                Array4<int const> const& cccmsk = crse_cc_mask.const_array(mfi);

                bool has_fine;
                if (Gpu::inLaunchRegion()) {
                    AMREX_ASSERT(ccbxg1 == crse_cc_mask[mfi].box());
                    has_fine = Reduce::AnyOf(ccbxg1,
                                             [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept -> bool
                    {
                        return cccmsk(i,j,k) == nonowner;
                    });
                } else {
                    has_fine = mlndlap_any_fine_sync_cells(ccbxg1,cccmsk,nonowner);
                }

                if (has_fine)
                {
                    const Box& ccvbx = amrex::enclosedCells(mfi.validbox());

                    u.resize(ccbxg1, AMREX_SPACEDIM);
                    Elixir ueli = u.elixir();
                    Array4<Real> const& uarr = u.array();

                    Box b = ccbxg1 & ccvbx;
                    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                    {
                        if (m_lobc[0][idim] == LinOpBCType::inflow)
                        {
                            if (b.smallEnd(idim) == ccdom.smallEnd(idim)) {
                                b.growLo(idim, 1);
                            }
                        }
                        if (m_hibc[0][idim] == LinOpBCType::inflow)
                        {
                            if (b.bigEnd(idim) == ccdom.bigEnd(idim)) {
                                b.growHi(idim, 1);
                            }
                        }
                    }

                    Array4<Real const> const& voarr = vold.const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                    {
                        if (b.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)){
                            AMREX_D_TERM(uarr(i,j,k,0) = voarr(i,j,k,0);,
                                         uarr(i,j,k,1) = voarr(i,j,k,1);,
                                         uarr(i,j,k,2) = voarr(i,j,k,2););
                        } else {
                            AMREX_D_TERM(uarr(i,j,k,0) = 0.0;,
                                         uarr(i,j,k,1) = 0.0;,
                                         uarr(i,j,k,2) = 0.0;);
                        }
                    });

                    rhs.resize(bx);
                    Elixir rhseli = rhs.elixir();
                    Array4<Real> const& rhsarr = rhs.array();
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            mlndlap_divu_eb(i,j,k,rhsarr,uarr,vfracarr,intgarr,dmskarr,dxinv,nddom,lobc,hibc);
                        });
                    }
                    else
#endif
                    {
#if (AMREX_SPACEDIM == 2)
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                        {
                            mlndlap_divu(i,j,k,rhsarr,uarr,dmskarr,dxinv,nddom,lobc,hibc,is_rz);
                        });
#else
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                        {
                            mlndlap_divu(i,j,k,rhsarr,uarr,dmskarr,dxinv,nddom,lobc,hibc);
                        });
#endif
                    }

                    if (rhcc)
                    {
                        Array4<Real> rhccarr = uarr;
                        Array4<Real const> const& rhccarr_orig = rhcc->const_array(mfi);
                        const Box& b2 = ccbxg1 & ccvbx;
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (b2.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)){
                                rhccarr(i,j,k) = rhccarr_orig(i,j,k);
                            } else {
                                rhccarr(i,j,k) = 0.0;
                            }
                        });

#ifdef AMREX_USE_EB
                        if (typ == FabType::singlevalued)
                        {
                            Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                            Array4<Real const> const& intgarr = intg->const_array(mfi);
                            AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                            {
                                Real rhs2 = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,dmskarr);
                                rhsarr(i,j,k) += rhs2;
                            });
                        }
                        else
#endif
                        {
                            AMREX_HOST_DEVICE_FOR_3D (bx, i, j, k,
                            {
                                Real rhs2 = mlndlap_rhcc(i,j,k,rhccarr,dmskarr);
                                rhsarr(i,j,k) += rhs2;
                            });
                        }
                    }

                    Array4<Real> const& sync_resid_a = sync_resid.array(mfi);
                    Array4<Real const> const& phiarr = phi.const_array(mfi);
#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);

                        Box stbx = bx;
                        AMREX_D_TERM(stbx.growLo(0,1);, stbx.growLo(1,1);, stbx.growLo(2,1));
                        Box const& sgbx = amrex::grow(amrex::enclosedCells(stbx),1);

                        constexpr int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
                        sten.resize(stbx,ncomp_s);
                        Elixir steneli = sten.elixir();
                        Array4<Real> const& stenarr = sten.array();

                        constexpr int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                        cn.resize(sgbx,ncomp_c+1);
                        Elixir cneli = cn.elixir();
                        Array4<Real> const& cnarr = cn.array();
                        Array4<Real> const& sgarr = cn.array(ncomp_c);

                        Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);

                        const Box& ibx = sgbx & amrex::enclosedCells(mfi.validbox());
                        AMREX_HOST_DEVICE_FOR_3D(sgbx, i, j, k,
                        {
                            if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                                sgarr(i,j,k) = sigmaarr_orig(i,j,k);
                            } else {
                                for (int n = 0; n < ncomp_c; ++n) {
                                    cnarr(i,j,k,n) = 0.0;
                                }
                                sgarr(i,j,k) = 0.0;
                            }
                        });

                        AMREX_HOST_DEVICE_FOR_3D(stbx, i, j, k,
                        {
                            mlndlap_set_stencil_eb(i, j, k, stenarr, sgarr, cnarr, dxinv);
                        });

                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            mlndlap_set_stencil_s0(i, j, k, stenarr);
                            sync_resid_a(i,j,k) = mlndlap_adotx_sten(i, j, k, phiarr, stenarr, dmskarr);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
                    }
                    else
#endif
                    {
                        Array4<Real> sigmaarr = uarr;
                        const Box& ibx = ccbxg1 & amrex::enclosedCells(mfi.validbox());
                        if (sigma_orig) {
                            Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);
                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                    sigmaarr(i,j,k) = sigmaarr_orig(i,j,k);
                                } else {
                                    sigmaarr(i,j,k) = 0.0;
                                }
                            });
                        } else {
                            Real const_sigma = m_const_sigma;
                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                    sigmaarr(i,j,k) = const_sigma;
                                } else {
                                    sigmaarr(i,j,k) = 0.0;
                                }
                            });
                        }

#if (AMREX_SPACEDIM == 2)
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i, j, k, phiarr, sigmaarr, dmskarr, is_rz, dxinv);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
#else
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i, j, k, phiarr, sigmaarr, dmskarr, dxinv);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
#endif
                    }
                }
            }
        }
    }
}